

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx512::CurveNiIntersectorK<4,4>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,4,8>,embree::avx512::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [12];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  Primitive PVar8;
  uint uVar9;
  int iVar10;
  undefined4 uVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined8 uVar23;
  long lVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  int iVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  byte bVar71;
  byte bVar72;
  ulong uVar73;
  uint uVar74;
  uint uVar75;
  ulong uVar76;
  uint uVar77;
  Geometry *pGVar78;
  uint uVar79;
  long lVar80;
  ulong uVar81;
  byte bVar82;
  float fVar83;
  float fVar135;
  float fVar137;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  float fVar84;
  undefined1 auVar93 [16];
  float fVar136;
  float fVar138;
  float fVar140;
  float fVar141;
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  float fVar139;
  float fVar142;
  float fVar143;
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined4 uVar144;
  vint4 bi_2;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined8 uVar158;
  vint4 bi_1;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  vint4 bi;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar166;
  float fVar182;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [64];
  float fVar183;
  float fVar190;
  float fVar191;
  vint4 ai_2;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  float fVar192;
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  vint4 ai;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  vint4 ai_1;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [32];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [32];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [64];
  undefined1 auVar218 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar219 [64];
  undefined1 auVar220 [64];
  undefined1 auVar221 [64];
  undefined1 auVar222 [64];
  undefined1 auVar223 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_8> bhit;
  undefined8 local_670;
  undefined8 uStack_668;
  Precalculations *local_658;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  RTCFilterFunctionNArguments local_630;
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  Geometry *local_5e8;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_590 [16];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined4 local_4e0;
  undefined4 uStack_4dc;
  undefined8 uStack_4d8;
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  LinearSpace3fa *local_4a8;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_430 [16];
  uint local_420;
  uint uStack_41c;
  uint uStack_418;
  uint uStack_414;
  uint uStack_410;
  uint uStack_40c;
  uint uStack_408;
  uint uStack_404;
  float local_400;
  undefined1 auStack_3fc [8];
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined4 local_380;
  int local_37c;
  undefined1 local_370 [16];
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  byte local_330;
  float local_320 [4];
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined1 local_2e0 [32];
  int local_2b0;
  int iStack_2ac;
  int iStack_2a8;
  int iStack_2a4;
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [16];
  undefined4 local_270;
  undefined4 uStack_26c;
  undefined4 uStack_268;
  undefined4 uStack_264;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined1 local_250 [16];
  uint local_240;
  uint uStack_23c;
  uint uStack_238;
  uint uStack_234;
  uint uStack_230;
  uint uStack_22c;
  uint uStack_228;
  uint uStack_224;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined1 local_1d0 [16];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined4 uStack_104;
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar203 [64];
  
  PVar8 = prim[1];
  uVar76 = (ulong)(byte)PVar8;
  fVar183 = *(float *)(prim + uVar76 * 0x19 + 0x12);
  auVar89 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar89 = vinsertps_avx(auVar89,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar87 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar87 = vinsertps_avx(auVar87,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar89 = vsubps_avx(auVar89,*(undefined1 (*) [16])(prim + uVar76 * 0x19 + 6));
  auVar167._0_4_ = fVar183 * auVar89._0_4_;
  auVar167._4_4_ = fVar183 * auVar89._4_4_;
  auVar167._8_4_ = fVar183 * auVar89._8_4_;
  auVar167._12_4_ = fVar183 * auVar89._12_4_;
  auVar145._0_4_ = fVar183 * auVar87._0_4_;
  auVar145._4_4_ = fVar183 * auVar87._4_4_;
  auVar145._8_4_ = fVar183 * auVar87._8_4_;
  auVar145._12_4_ = fVar183 * auVar87._12_4_;
  auVar89 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 4 + 6)));
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar87 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 5 + 6)));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar91 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 6 + 6)));
  auVar148 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 0xb + 6)));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar148 = vcvtdq2ps_avx(auVar148);
  auVar147 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar8 * 0xc) + 6)));
  auVar147 = vcvtdq2ps_avx(auVar147);
  auVar90 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar8 * 0xc + uVar76 + 6)));
  auVar90 = vcvtdq2ps_avx(auVar90);
  uVar81 = (ulong)(uint)((int)(uVar76 * 9) * 2);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 + uVar76 + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  uVar73 = (ulong)(uint)((int)(uVar76 * 5) << 2);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar212._4_4_ = auVar145._0_4_;
  auVar212._0_4_ = auVar145._0_4_;
  auVar212._8_4_ = auVar145._0_4_;
  auVar212._12_4_ = auVar145._0_4_;
  auVar92 = vshufps_avx(auVar145,auVar145,0x55);
  auVar88 = vshufps_avx(auVar145,auVar145,0xaa);
  fVar183 = auVar88._0_4_;
  auVar161._0_4_ = fVar183 * auVar91._0_4_;
  fVar190 = auVar88._4_4_;
  auVar161._4_4_ = fVar190 * auVar91._4_4_;
  fVar191 = auVar88._8_4_;
  auVar161._8_4_ = fVar191 * auVar91._8_4_;
  fVar192 = auVar88._12_4_;
  auVar161._12_4_ = fVar192 * auVar91._12_4_;
  auVar159._0_4_ = auVar90._0_4_ * fVar183;
  auVar159._4_4_ = auVar90._4_4_ * fVar190;
  auVar159._8_4_ = auVar90._8_4_ * fVar191;
  auVar159._12_4_ = auVar90._12_4_ * fVar192;
  auVar93._0_4_ = auVar22._0_4_ * fVar183;
  auVar93._4_4_ = auVar22._4_4_ * fVar190;
  auVar93._8_4_ = auVar22._8_4_ * fVar191;
  auVar93._12_4_ = auVar22._12_4_ * fVar192;
  auVar88 = vfmadd231ps_fma(auVar161,auVar92,auVar87);
  auVar86 = vfmadd231ps_fma(auVar159,auVar92,auVar147);
  auVar92 = vfmadd231ps_fma(auVar93,auVar21,auVar92);
  auVar85 = vfmadd231ps_fma(auVar88,auVar212,auVar89);
  auVar86 = vfmadd231ps_fma(auVar86,auVar212,auVar148);
  auVar145 = vfmadd231ps_fma(auVar92,auVar20,auVar212);
  auVar213._4_4_ = auVar167._0_4_;
  auVar213._0_4_ = auVar167._0_4_;
  auVar213._8_4_ = auVar167._0_4_;
  auVar213._12_4_ = auVar167._0_4_;
  auVar92 = vshufps_avx(auVar167,auVar167,0x55);
  auVar88 = vshufps_avx(auVar167,auVar167,0xaa);
  fVar183 = auVar88._0_4_;
  auVar214._0_4_ = fVar183 * auVar91._0_4_;
  fVar190 = auVar88._4_4_;
  auVar214._4_4_ = fVar190 * auVar91._4_4_;
  fVar191 = auVar88._8_4_;
  auVar214._8_4_ = fVar191 * auVar91._8_4_;
  fVar192 = auVar88._12_4_;
  auVar214._12_4_ = fVar192 * auVar91._12_4_;
  auVar184._0_4_ = auVar90._0_4_ * fVar183;
  auVar184._4_4_ = auVar90._4_4_ * fVar190;
  auVar184._8_4_ = auVar90._8_4_ * fVar191;
  auVar184._12_4_ = auVar90._12_4_ * fVar192;
  auVar168._0_4_ = auVar22._0_4_ * fVar183;
  auVar168._4_4_ = auVar22._4_4_ * fVar190;
  auVar168._8_4_ = auVar22._8_4_ * fVar191;
  auVar168._12_4_ = auVar22._12_4_ * fVar192;
  auVar87 = vfmadd231ps_fma(auVar214,auVar92,auVar87);
  auVar91 = vfmadd231ps_fma(auVar184,auVar92,auVar147);
  auVar147 = vfmadd231ps_fma(auVar168,auVar92,auVar21);
  auVar90 = vfmadd231ps_fma(auVar87,auVar213,auVar89);
  auVar21 = vfmadd231ps_fma(auVar91,auVar213,auVar148);
  auVar204._8_4_ = 0x7fffffff;
  auVar204._0_8_ = 0x7fffffff7fffffff;
  auVar204._12_4_ = 0x7fffffff;
  auVar22 = vfmadd231ps_fma(auVar147,auVar213,auVar20);
  auVar89 = vandps_avx(auVar85,auVar204);
  auVar200._8_4_ = 0x219392ef;
  auVar200._0_8_ = 0x219392ef219392ef;
  auVar200._12_4_ = 0x219392ef;
  uVar81 = vcmpps_avx512vl(auVar89,auVar200,1);
  bVar13 = (bool)((byte)uVar81 & 1);
  auVar88._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar85._0_4_;
  bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
  auVar88._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar85._4_4_;
  bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
  auVar88._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar85._8_4_;
  bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
  auVar88._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar85._12_4_;
  auVar89 = vandps_avx(auVar86,auVar204);
  uVar81 = vcmpps_avx512vl(auVar89,auVar200,1);
  bVar13 = (bool)((byte)uVar81 & 1);
  auVar85._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar86._0_4_;
  bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
  auVar85._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar86._4_4_;
  bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
  auVar85._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar86._8_4_;
  bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
  auVar85._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar86._12_4_;
  auVar89 = vandps_avx(auVar145,auVar204);
  uVar81 = vcmpps_avx512vl(auVar89,auVar200,1);
  bVar13 = (bool)((byte)uVar81 & 1);
  auVar86._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar145._0_4_;
  bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
  auVar86._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar145._4_4_;
  bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
  auVar86._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar145._8_4_;
  bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
  auVar86._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar145._12_4_;
  auVar87 = vrcp14ps_avx512vl(auVar88);
  auVar201._8_4_ = 0x3f800000;
  auVar201._0_8_ = &DAT_3f8000003f800000;
  auVar201._12_4_ = 0x3f800000;
  auVar89 = vfnmadd213ps_fma(auVar88,auVar87,auVar201);
  auVar148 = vfmadd132ps_fma(auVar89,auVar87,auVar87);
  auVar87 = vrcp14ps_avx512vl(auVar85);
  auVar89 = vfnmadd213ps_fma(auVar85,auVar87,auVar201);
  auVar147 = vfmadd132ps_fma(auVar89,auVar87,auVar87);
  auVar87 = vrcp14ps_avx512vl(auVar86);
  auVar89 = vfnmadd213ps_fma(auVar86,auVar87,auVar201);
  auVar20 = vfmadd132ps_fma(auVar89,auVar87,auVar87);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar76 * 7 + 6);
  auVar89 = vpmovsxwd_avx(auVar89);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,auVar90);
  auVar193._0_4_ = auVar148._0_4_ * auVar89._0_4_;
  auVar193._4_4_ = auVar148._4_4_ * auVar89._4_4_;
  auVar193._8_4_ = auVar148._8_4_ * auVar89._8_4_;
  auVar193._12_4_ = auVar148._12_4_ * auVar89._12_4_;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar76 * 9 + 6);
  auVar89 = vpmovsxwd_avx(auVar87);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,auVar90);
  auVar88 = vpbroadcastd_avx512vl();
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + 6);
  auVar87 = vpmovsxwd_avx(auVar91);
  auVar162._0_4_ = auVar148._0_4_ * auVar89._0_4_;
  auVar162._4_4_ = auVar148._4_4_ * auVar89._4_4_;
  auVar162._8_4_ = auVar148._8_4_ * auVar89._8_4_;
  auVar162._12_4_ = auVar148._12_4_ * auVar89._12_4_;
  auVar148._8_8_ = 0;
  auVar148._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + uVar76 * -2 + 6);
  auVar89 = vpmovsxwd_avx(auVar148);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,auVar21);
  auVar202._0_4_ = auVar147._0_4_ * auVar89._0_4_;
  auVar202._4_4_ = auVar147._4_4_ * auVar89._4_4_;
  auVar202._8_4_ = auVar147._8_4_ * auVar89._8_4_;
  auVar202._12_4_ = auVar147._12_4_ * auVar89._12_4_;
  auVar203 = ZEXT1664(auVar202);
  auVar89 = vcvtdq2ps_avx(auVar87);
  auVar89 = vsubps_avx(auVar89,auVar21);
  auVar160._0_4_ = auVar147._0_4_ * auVar89._0_4_;
  auVar160._4_4_ = auVar147._4_4_ * auVar89._4_4_;
  auVar160._8_4_ = auVar147._8_4_ * auVar89._8_4_;
  auVar160._12_4_ = auVar147._12_4_ * auVar89._12_4_;
  auVar147._8_8_ = 0;
  auVar147._0_8_ = *(ulong *)(prim + uVar73 + uVar76 + 6);
  auVar89 = vpmovsxwd_avx(auVar147);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,auVar22);
  auVar185._0_4_ = auVar20._0_4_ * auVar89._0_4_;
  auVar185._4_4_ = auVar20._4_4_ * auVar89._4_4_;
  auVar185._8_4_ = auVar20._8_4_ * auVar89._8_4_;
  auVar185._12_4_ = auVar20._12_4_ * auVar89._12_4_;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar76 * 0x17 + 6);
  auVar89 = vpmovsxwd_avx(auVar90);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,auVar22);
  auVar146._0_4_ = auVar20._0_4_ * auVar89._0_4_;
  auVar146._4_4_ = auVar20._4_4_ * auVar89._4_4_;
  auVar146._8_4_ = auVar20._8_4_ * auVar89._8_4_;
  auVar146._12_4_ = auVar20._12_4_ * auVar89._12_4_;
  auVar89 = vpminsd_avx(auVar193,auVar162);
  auVar87 = vpminsd_avx(auVar202,auVar160);
  auVar89 = vmaxps_avx(auVar89,auVar87);
  auVar87 = vpminsd_avx(auVar185,auVar146);
  uVar144 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar20._4_4_ = uVar144;
  auVar20._0_4_ = uVar144;
  auVar20._8_4_ = uVar144;
  auVar20._12_4_ = uVar144;
  auVar87 = vmaxps_avx512vl(auVar87,auVar20);
  auVar89 = vmaxps_avx(auVar89,auVar87);
  auVar21._8_4_ = 0x3f7ffffa;
  auVar21._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar21._12_4_ = 0x3f7ffffa;
  local_1d0 = vmulps_avx512vl(auVar89,auVar21);
  auVar181 = ZEXT1664(local_1d0);
  auVar89 = vpmaxsd_avx(auVar193,auVar162);
  auVar87 = vpmaxsd_avx(auVar202,auVar160);
  auVar89 = vminps_avx(auVar89,auVar87);
  auVar87 = vpmaxsd_avx(auVar185,auVar146);
  uVar144 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar22._4_4_ = uVar144;
  auVar22._0_4_ = uVar144;
  auVar22._8_4_ = uVar144;
  auVar22._12_4_ = uVar144;
  auVar87 = vminps_avx512vl(auVar87,auVar22);
  auVar89 = vminps_avx(auVar89,auVar87);
  auVar92._8_4_ = 0x3f800003;
  auVar92._0_8_ = 0x3f8000033f800003;
  auVar92._12_4_ = 0x3f800003;
  auVar89 = vmulps_avx512vl(auVar89,auVar92);
  uVar158 = vcmpps_avx512vl(local_1d0,auVar89,2);
  uVar81 = vpcmpgtd_avx512vl(auVar88,_DAT_01ff0cf0);
  uVar81 = ((byte)uVar158 & 0xf) & uVar81;
  if ((char)uVar81 != '\0') {
    local_4a8 = pre->ray_space + k;
    local_430 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_658 = pre;
    do {
      auVar179 = auVar203._0_32_;
      auVar121 = auVar181._0_32_;
      local_540 = in_ZMM21._0_32_;
      local_520 = in_ZMM20._0_32_;
      lVar24 = 0;
      for (uVar73 = uVar81; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x8000000000000000) {
        lVar24 = lVar24 + 1;
      }
      uVar79 = *(uint *)(prim + 2);
      uVar9 = *(uint *)(prim + lVar24 * 4 + 6);
      pGVar78 = (context->scene->geometries).items[uVar79].ptr;
      uVar73 = (ulong)*(uint *)(*(long *)&pGVar78->field_0x58 +
                               pGVar78[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i * (ulong)uVar9);
      p_Var12 = pGVar78[1].intersectionFilterN;
      lVar24 = *(long *)&pGVar78[1].time_range.upper;
      auVar89 = *(undefined1 (*) [16])(lVar24 + (long)p_Var12 * uVar73);
      pauVar3 = (undefined1 (*) [16])(lVar24 + (uVar73 + 1) * (long)p_Var12);
      local_640 = *(undefined8 *)*pauVar3;
      uStack_638 = *(undefined8 *)(*pauVar3 + 8);
      auVar87 = *pauVar3;
      pauVar4 = (undefined1 (*) [16])(lVar24 + (uVar73 + 2) * (long)p_Var12);
      local_650 = *(undefined8 *)*pauVar4;
      uStack_648 = *(undefined8 *)(*pauVar4 + 8);
      auVar91 = *pauVar4;
      uVar81 = uVar81 - 1 & uVar81;
      pauVar5 = (undefined1 (*) [12])(lVar24 + (uVar73 + 3) * (long)p_Var12);
      local_340 = *(undefined8 *)*pauVar5;
      uStack_338 = *(undefined8 *)(*pauVar5 + 8);
      local_600 = (float)local_340;
      fStack_5fc = (float)((ulong)local_340 >> 0x20);
      fStack_5f8 = (float)uStack_338;
      fStack_5f4 = (float)((ulong)uStack_338 >> 0x20);
      if (uVar81 != 0) {
        uVar76 = uVar81 - 1 & uVar81;
        for (uVar73 = uVar81; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x8000000000000000) {
        }
        if (uVar76 != 0) {
          for (; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar10 = (int)pGVar78[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar148 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c);
      auVar148 = vinsertps_avx(auVar148,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar90 = vsubps_avx(auVar89,auVar148);
      uVar144 = auVar90._0_4_;
      auVar163._4_4_ = uVar144;
      auVar163._0_4_ = uVar144;
      auVar163._8_4_ = uVar144;
      auVar163._12_4_ = uVar144;
      auVar147 = vshufps_avx(auVar90,auVar90,0x55);
      auVar90 = vshufps_avx(auVar90,auVar90,0xaa);
      aVar6 = (local_4a8->vx).field_0;
      aVar7 = (local_4a8->vy).field_0;
      fVar183 = (local_4a8->vz).field_0.m128[0];
      fVar190 = *(float *)((long)&(local_4a8->vz).field_0 + 4);
      fVar191 = *(float *)((long)&(local_4a8->vz).field_0 + 8);
      fVar192 = *(float *)((long)&(local_4a8->vz).field_0 + 0xc);
      auVar207._0_4_ = fVar183 * auVar90._0_4_;
      auVar207._4_4_ = fVar190 * auVar90._4_4_;
      auVar207._8_4_ = fVar191 * auVar90._8_4_;
      auVar207._12_4_ = fVar192 * auVar90._12_4_;
      auVar147 = vfmadd231ps_fma(auVar207,(undefined1  [16])aVar7,auVar147);
      auVar21 = vfmadd231ps_fma(auVar147,(undefined1  [16])aVar6,auVar163);
      auVar147 = vshufps_avx(auVar89,auVar89,0xff);
      auVar20 = vsubps_avx(auVar87,auVar148);
      uVar144 = auVar20._0_4_;
      auVar169._4_4_ = uVar144;
      auVar169._0_4_ = uVar144;
      auVar169._8_4_ = uVar144;
      auVar169._12_4_ = uVar144;
      auVar90 = vshufps_avx(auVar20,auVar20,0x55);
      auVar20 = vshufps_avx(auVar20,auVar20,0xaa);
      auVar208._0_4_ = fVar183 * auVar20._0_4_;
      auVar208._4_4_ = fVar190 * auVar20._4_4_;
      auVar208._8_4_ = fVar191 * auVar20._8_4_;
      auVar208._12_4_ = fVar192 * auVar20._12_4_;
      auVar90 = vfmadd231ps_fma(auVar208,(undefined1  [16])aVar7,auVar90);
      auVar22 = vfmadd231ps_fma(auVar90,(undefined1  [16])aVar6,auVar169);
      auVar87 = vshufps_avx(auVar87,auVar87,0xff);
      auVar20 = vsubps_avx(auVar91,auVar148);
      uVar144 = auVar20._0_4_;
      auVar205._4_4_ = uVar144;
      auVar205._0_4_ = uVar144;
      auVar205._8_4_ = uVar144;
      auVar205._12_4_ = uVar144;
      auVar90 = vshufps_avx(auVar20,auVar20,0x55);
      auVar20 = vshufps_avx(auVar20,auVar20,0xaa);
      auVar210._0_4_ = fVar183 * auVar20._0_4_;
      auVar210._4_4_ = fVar190 * auVar20._4_4_;
      auVar210._8_4_ = fVar191 * auVar20._8_4_;
      auVar210._12_4_ = fVar192 * auVar20._12_4_;
      auVar90 = vfmadd231ps_fma(auVar210,(undefined1  [16])aVar7,auVar90);
      auVar20 = vfmadd231ps_fma(auVar90,(undefined1  [16])aVar6,auVar205);
      auVar91 = vshufps_avx(auVar91,auVar91,0xff);
      auVar65._12_4_ = fStack_5f4;
      auVar65._0_12_ = *pauVar5;
      auVar90 = vsubps_avx512vl(auVar65,auVar148);
      uVar144 = auVar90._0_4_;
      auVar170._4_4_ = uVar144;
      auVar170._0_4_ = uVar144;
      auVar170._8_4_ = uVar144;
      auVar170._12_4_ = uVar144;
      auVar148 = vshufps_avx(auVar90,auVar90,0x55);
      auVar90 = vshufps_avx(auVar90,auVar90,0xaa);
      auVar211._0_4_ = fVar183 * auVar90._0_4_;
      auVar211._4_4_ = fVar190 * auVar90._4_4_;
      auVar211._8_4_ = fVar191 * auVar90._8_4_;
      auVar211._12_4_ = fVar192 * auVar90._12_4_;
      auVar148 = vfmadd231ps_fma(auVar211,(undefined1  [16])aVar7,auVar148);
      auVar148 = vfmadd231ps_fma(auVar148,(undefined1  [16])aVar6,auVar170);
      lVar24 = (long)iVar10 * 0x44;
      auVar112 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24);
      auVar90 = vshufps_avx512vl(auVar65,auVar65,0xff);
      local_480 = vbroadcastss_avx512vl(auVar21);
      auVar96._8_4_ = 1;
      auVar96._0_8_ = 0x100000001;
      auVar96._12_4_ = 1;
      auVar96._16_4_ = 1;
      auVar96._20_4_ = 1;
      auVar96._24_4_ = 1;
      auVar96._28_4_ = 1;
      local_5c0 = vpermps_avx512vl(auVar96,ZEXT1632(auVar21));
      uVar158 = auVar147._0_8_;
      local_80._8_8_ = uVar158;
      local_80._0_8_ = uVar158;
      local_80._16_8_ = uVar158;
      local_80._24_8_ = uVar158;
      auVar113 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x484);
      uVar144 = auVar22._0_4_;
      local_5e0._4_4_ = uVar144;
      local_5e0._0_4_ = uVar144;
      local_5e0._8_4_ = uVar144;
      local_5e0._12_4_ = uVar144;
      local_5e0._16_4_ = uVar144;
      local_5e0._20_4_ = uVar144;
      local_5e0._24_4_ = uVar144;
      local_5e0._28_4_ = uVar144;
      local_1c0 = vpermps_avx512vl(auVar96,ZEXT1632(auVar22));
      uVar158 = auVar87._0_8_;
      local_a0._8_8_ = uVar158;
      local_a0._0_8_ = uVar158;
      local_a0._16_8_ = uVar158;
      local_a0._24_8_ = uVar158;
      auVar111 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x908);
      local_c0 = vbroadcastss_avx512vl(auVar20);
      local_e0 = vpermps_avx512vl(auVar96,ZEXT1632(auVar20));
      local_100 = vbroadcastsd_avx512vl(auVar91);
      auVar110 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0xd8c);
      local_560 = vbroadcastss_avx512vl(auVar148);
      auVar221 = ZEXT3264(local_560);
      local_580 = vpermps_avx512vl(auVar96,ZEXT1632(auVar148));
      auVar222 = ZEXT3264(local_580);
      _local_120 = vbroadcastsd_avx512vl(auVar90);
      auVar96 = vmulps_avx512vl(local_560,auVar110);
      auVar97 = vmulps_avx512vl(local_580,auVar110);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar111,local_c0);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar111,local_e0);
      auVar87 = vfmadd231ps_fma(auVar96,auVar113,local_5e0);
      auVar98 = vfmadd231ps_avx512vl(auVar97,auVar113,local_1c0);
      auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),auVar112,local_480);
      auVar96 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24);
      auVar97 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x484);
      auVar100 = vfmadd231ps_avx512vl(auVar98,auVar112,local_5c0);
      auVar98 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x908);
      auVar109 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0xd8c);
      auVar101 = vmulps_avx512vl(local_560,auVar109);
      auVar102 = vmulps_avx512vl(local_580,auVar109);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar98,local_c0);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar98,local_e0);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar97,local_5e0);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar97,local_1c0);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar96,local_480);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar96,local_5c0);
      auVar103 = vsubps_avx512vl(auVar101,auVar99);
      auVar104 = vsubps_avx512vl(auVar102,auVar100);
      auVar105 = vmulps_avx512vl(auVar100,auVar103);
      auVar106 = vmulps_avx512vl(auVar99,auVar104);
      auVar105 = vsubps_avx512vl(auVar105,auVar106);
      auVar106 = vmulps_avx512vl(_local_120,auVar110);
      auVar106 = vfmadd231ps_avx512vl(auVar106,auVar111,local_100);
      auVar87 = vfmadd231ps_fma(auVar106,auVar113,local_a0);
      auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),auVar112,local_80);
      auVar107 = vmulps_avx512vl(_local_120,auVar109);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar98,local_100);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar97,local_a0);
      auVar147 = vfmadd231ps_fma(auVar107,auVar96,local_80);
      auVar107 = vmulps_avx512vl(auVar104,auVar104);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar103,auVar103);
      auVar108 = vmaxps_avx512vl(auVar106,ZEXT1632(auVar147));
      auVar108 = vmulps_avx512vl(auVar108,auVar108);
      auVar107 = vmulps_avx512vl(auVar108,auVar107);
      auVar105 = vmulps_avx512vl(auVar105,auVar105);
      uVar158 = vcmpps_avx512vl(auVar105,auVar107,2);
      auVar87 = vblendps_avx(auVar21,auVar89,8);
      auVar90 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar91 = vandps_avx512vl(auVar87,auVar90);
      auVar87 = vblendps_avx(auVar22,*pauVar3,8);
      auVar87 = vandps_avx512vl(auVar87,auVar90);
      auVar91 = vmaxps_avx(auVar91,auVar87);
      auVar87 = vblendps_avx(auVar20,*pauVar4,8);
      auVar92 = vandps_avx512vl(auVar87,auVar90);
      auVar87 = vblendps_avx(auVar148,auVar65,8);
      auVar87 = vandps_avx512vl(auVar87,auVar90);
      auVar87 = vmaxps_avx(auVar92,auVar87);
      auVar87 = vmaxps_avx(auVar91,auVar87);
      auVar91 = vmovshdup_avx(auVar87);
      auVar91 = vmaxss_avx(auVar91,auVar87);
      auVar87 = vshufpd_avx(auVar87,auVar87,1);
      auVar87 = vmaxss_avx(auVar87,auVar91);
      auVar107._0_4_ = (float)iVar10;
      _auStack_3fc = auVar21._4_12_;
      auVar107._4_4_ = auVar107._0_4_;
      auVar107._8_4_ = auVar107._0_4_;
      auVar107._12_4_ = auVar107._0_4_;
      auVar107._16_4_ = auVar107._0_4_;
      auVar107._20_4_ = auVar107._0_4_;
      auVar107._24_4_ = auVar107._0_4_;
      auVar107._28_4_ = auVar107._0_4_;
      uVar23 = vcmpps_avx512vl(auVar107,_DAT_02020f40,0xe);
      bVar82 = (byte)uVar158 & (byte)uVar23;
      auVar87 = vmulss_avx512f(auVar87,ZEXT416(0x35000000));
      auVar105._8_4_ = 2;
      auVar105._0_8_ = 0x200000002;
      auVar105._12_4_ = 2;
      auVar105._16_4_ = 2;
      auVar105._20_4_ = 2;
      auVar105._24_4_ = 2;
      auVar105._28_4_ = 2;
      local_140 = vpermps_avx512vl(auVar105,ZEXT1632(auVar21));
      local_160 = vpermps_avx512vl(auVar105,ZEXT1632(auVar22));
      local_180 = vpermps_avx512vl(auVar105,ZEXT1632(auVar20));
      local_1a0 = vpermps_avx2(auVar105,ZEXT1632(auVar148));
      uVar77 = *(uint *)(ray + k * 4 + 0x30);
      auVar91 = local_c0._0_16_;
      local_400 = auVar107._0_4_;
      if (bVar82 == 0) {
        auVar91 = vxorps_avx512vl(auVar91,auVar91);
        auVar220 = ZEXT1664(auVar91);
        auVar203 = ZEXT3264(auVar179);
        in_ZMM20 = ZEXT3264(local_520);
        auVar181 = ZEXT3264(auVar121);
        in_ZMM21 = ZEXT3264(local_540);
        auVar219 = ZEXT3264(local_480);
        auVar218 = ZEXT3264(local_5c0);
        auVar217 = ZEXT3264(local_5e0);
      }
      else {
        local_4a0._0_16_ = ZEXT416(uVar77);
        local_460._0_16_ = auVar87;
        auVar109 = vmulps_avx512vl(local_1a0,auVar109);
        auVar98 = vfmadd213ps_avx512vl(auVar98,local_180,auVar109);
        auVar97 = vfmadd213ps_avx512vl(auVar97,local_160,auVar98);
        auVar109 = vfmadd213ps_avx512vl(auVar96,local_140,auVar97);
        auVar110 = vmulps_avx512vl(local_1a0,auVar110);
        auVar111 = vfmadd213ps_avx512vl(auVar111,local_180,auVar110);
        auVar97 = vfmadd213ps_avx512vl(auVar113,local_160,auVar111);
        auVar113 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x1210);
        auVar111 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x1694);
        auVar110 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x1b18);
        auVar96 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x1f9c);
        auVar105 = vfmadd213ps_avx512vl(auVar112,local_140,auVar97);
        auVar112 = vmulps_avx512vl(local_560,auVar96);
        auVar97 = vmulps_avx512vl(local_580,auVar96);
        auVar96 = vmulps_avx512vl(local_1a0,auVar96);
        auVar112 = vfmadd231ps_avx512vl(auVar112,auVar110,local_c0);
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar110,local_e0);
        auVar110 = vfmadd231ps_avx512vl(auVar96,local_180,auVar110);
        auVar112 = vfmadd231ps_avx512vl(auVar112,auVar111,local_5e0);
        auVar96 = vfmadd231ps_avx512vl(auVar97,auVar111,local_1c0);
        auVar97 = vfmadd231ps_avx512vl(auVar110,local_160,auVar111);
        auVar98 = vfmadd231ps_avx512vl(auVar112,auVar113,local_480);
        auVar218 = ZEXT3264(local_5c0);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar113,local_5c0);
        auVar112 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x1210);
        auVar111 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x1b18);
        auVar110 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x1f9c);
        auVar97 = vfmadd231ps_avx512vl(auVar97,local_140,auVar113);
        auVar113 = vmulps_avx512vl(local_560,auVar110);
        auVar108 = vmulps_avx512vl(local_580,auVar110);
        auVar110 = vmulps_avx512vl(local_1a0,auVar110);
        auVar223 = ZEXT1664(auVar87);
        auVar114 = vfmadd231ps_avx512vl(auVar113,auVar111,local_c0);
        auVar108 = vfmadd231ps_avx512vl(auVar108,auVar111,local_e0);
        auVar111 = vfmadd231ps_avx512vl(auVar110,local_180,auVar111);
        auVar113 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x1694);
        auVar110 = vfmadd231ps_avx512vl(auVar114,auVar113,local_5e0);
        auVar108 = vfmadd231ps_avx512vl(auVar108,auVar113,local_1c0);
        auVar113 = vfmadd231ps_avx512vl(auVar111,local_160,auVar113);
        auVar111 = vfmadd231ps_avx512vl(auVar110,auVar112,local_480);
        auVar110 = vfmadd231ps_avx512vl(auVar108,auVar112,local_5c0);
        auVar108 = vfmadd231ps_avx512vl(auVar113,local_140,auVar112);
        auVar215._8_4_ = 0x7fffffff;
        auVar215._0_8_ = 0x7fffffff7fffffff;
        auVar215._12_4_ = 0x7fffffff;
        auVar215._16_4_ = 0x7fffffff;
        auVar215._20_4_ = 0x7fffffff;
        auVar215._24_4_ = 0x7fffffff;
        auVar215._28_4_ = 0x7fffffff;
        auVar112 = vandps_avx(auVar98,auVar215);
        auVar113 = vandps_avx(auVar96,auVar215);
        auVar113 = vmaxps_avx(auVar112,auVar113);
        auVar112 = vandps_avx(auVar97,auVar215);
        auVar112 = vmaxps_avx(auVar113,auVar112);
        auVar97 = vbroadcastss_avx512vl(auVar87);
        uVar73 = vcmpps_avx512vl(auVar112,auVar97,1);
        bVar13 = (bool)((byte)uVar73 & 1);
        auVar114._0_4_ = (float)((uint)bVar13 * auVar103._0_4_ | (uint)!bVar13 * auVar98._0_4_);
        bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar114._4_4_ = (float)((uint)bVar13 * auVar103._4_4_ | (uint)!bVar13 * auVar98._4_4_);
        bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar114._8_4_ = (float)((uint)bVar13 * auVar103._8_4_ | (uint)!bVar13 * auVar98._8_4_);
        bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar114._12_4_ = (float)((uint)bVar13 * auVar103._12_4_ | (uint)!bVar13 * auVar98._12_4_);
        bVar13 = (bool)((byte)(uVar73 >> 4) & 1);
        auVar114._16_4_ = (float)((uint)bVar13 * auVar103._16_4_ | (uint)!bVar13 * auVar98._16_4_);
        bVar13 = (bool)((byte)(uVar73 >> 5) & 1);
        auVar114._20_4_ = (float)((uint)bVar13 * auVar103._20_4_ | (uint)!bVar13 * auVar98._20_4_);
        bVar13 = (bool)((byte)(uVar73 >> 6) & 1);
        auVar114._24_4_ = (float)((uint)bVar13 * auVar103._24_4_ | (uint)!bVar13 * auVar98._24_4_);
        bVar13 = SUB81(uVar73 >> 7,0);
        auVar114._28_4_ = (uint)bVar13 * auVar103._28_4_ | (uint)!bVar13 * auVar98._28_4_;
        bVar13 = (bool)((byte)uVar73 & 1);
        auVar115._0_4_ = (float)((uint)bVar13 * auVar104._0_4_ | (uint)!bVar13 * auVar96._0_4_);
        bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar115._4_4_ = (float)((uint)bVar13 * auVar104._4_4_ | (uint)!bVar13 * auVar96._4_4_);
        bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar115._8_4_ = (float)((uint)bVar13 * auVar104._8_4_ | (uint)!bVar13 * auVar96._8_4_);
        bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar115._12_4_ = (float)((uint)bVar13 * auVar104._12_4_ | (uint)!bVar13 * auVar96._12_4_);
        bVar13 = (bool)((byte)(uVar73 >> 4) & 1);
        auVar115._16_4_ = (float)((uint)bVar13 * auVar104._16_4_ | (uint)!bVar13 * auVar96._16_4_);
        bVar13 = (bool)((byte)(uVar73 >> 5) & 1);
        auVar115._20_4_ = (float)((uint)bVar13 * auVar104._20_4_ | (uint)!bVar13 * auVar96._20_4_);
        bVar13 = (bool)((byte)(uVar73 >> 6) & 1);
        auVar115._24_4_ = (float)((uint)bVar13 * auVar104._24_4_ | (uint)!bVar13 * auVar96._24_4_);
        bVar13 = SUB81(uVar73 >> 7,0);
        auVar115._28_4_ = (uint)bVar13 * auVar104._28_4_ | (uint)!bVar13 * auVar96._28_4_;
        auVar112 = vandps_avx(auVar215,auVar111);
        auVar113 = vandps_avx(auVar110,auVar215);
        auVar113 = vmaxps_avx(auVar112,auVar113);
        auVar112 = vandps_avx(auVar108,auVar215);
        auVar112 = vmaxps_avx(auVar113,auVar112);
        uVar73 = vcmpps_avx512vl(auVar112,auVar97,1);
        bVar13 = (bool)((byte)uVar73 & 1);
        auVar108._0_4_ = (float)((uint)bVar13 * auVar103._0_4_ | (uint)!bVar13 * auVar111._0_4_);
        bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar108._4_4_ = (float)((uint)bVar13 * auVar103._4_4_ | (uint)!bVar13 * auVar111._4_4_);
        bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar108._8_4_ = (float)((uint)bVar13 * auVar103._8_4_ | (uint)!bVar13 * auVar111._8_4_);
        bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar108._12_4_ = (float)((uint)bVar13 * auVar103._12_4_ | (uint)!bVar13 * auVar111._12_4_);
        bVar13 = (bool)((byte)(uVar73 >> 4) & 1);
        auVar108._16_4_ = (float)((uint)bVar13 * auVar103._16_4_ | (uint)!bVar13 * auVar111._16_4_);
        bVar13 = (bool)((byte)(uVar73 >> 5) & 1);
        auVar108._20_4_ = (float)((uint)bVar13 * auVar103._20_4_ | (uint)!bVar13 * auVar111._20_4_);
        bVar13 = (bool)((byte)(uVar73 >> 6) & 1);
        auVar108._24_4_ = (float)((uint)bVar13 * auVar103._24_4_ | (uint)!bVar13 * auVar111._24_4_);
        bVar13 = SUB81(uVar73 >> 7,0);
        auVar108._28_4_ = (uint)bVar13 * auVar103._28_4_ | (uint)!bVar13 * auVar111._28_4_;
        bVar13 = (bool)((byte)uVar73 & 1);
        auVar103._0_4_ = (float)((uint)bVar13 * auVar104._0_4_ | (uint)!bVar13 * auVar110._0_4_);
        bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar103._4_4_ = (float)((uint)bVar13 * auVar104._4_4_ | (uint)!bVar13 * auVar110._4_4_);
        bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar103._8_4_ = (float)((uint)bVar13 * auVar104._8_4_ | (uint)!bVar13 * auVar110._8_4_);
        bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar103._12_4_ = (float)((uint)bVar13 * auVar104._12_4_ | (uint)!bVar13 * auVar110._12_4_);
        bVar13 = (bool)((byte)(uVar73 >> 4) & 1);
        auVar103._16_4_ = (float)((uint)bVar13 * auVar104._16_4_ | (uint)!bVar13 * auVar110._16_4_);
        bVar13 = (bool)((byte)(uVar73 >> 5) & 1);
        auVar103._20_4_ = (float)((uint)bVar13 * auVar104._20_4_ | (uint)!bVar13 * auVar110._20_4_);
        bVar13 = (bool)((byte)(uVar73 >> 6) & 1);
        auVar103._24_4_ = (float)((uint)bVar13 * auVar104._24_4_ | (uint)!bVar13 * auVar110._24_4_);
        bVar13 = SUB81(uVar73 >> 7,0);
        auVar103._28_4_ = (uint)bVar13 * auVar104._28_4_ | (uint)!bVar13 * auVar110._28_4_;
        auVar93 = vxorps_avx512vl(auVar91,auVar91);
        auVar220 = ZEXT1664(auVar93);
        auVar112 = vfmadd213ps_avx512vl(auVar114,auVar114,ZEXT1632(auVar93));
        auVar91 = vfmadd231ps_fma(auVar112,auVar115,auVar115);
        auVar111 = vrsqrt14ps_avx512vl(ZEXT1632(auVar91));
        fVar183 = auVar111._0_4_;
        fVar190 = auVar111._4_4_;
        fVar191 = auVar111._8_4_;
        fVar192 = auVar111._12_4_;
        fVar166 = auVar111._16_4_;
        fVar182 = auVar111._20_4_;
        fVar83 = auVar111._24_4_;
        auVar112._4_4_ = fVar190 * fVar190 * fVar190 * auVar91._4_4_ * -0.5;
        auVar112._0_4_ = fVar183 * fVar183 * fVar183 * auVar91._0_4_ * -0.5;
        auVar112._8_4_ = fVar191 * fVar191 * fVar191 * auVar91._8_4_ * -0.5;
        auVar112._12_4_ = fVar192 * fVar192 * fVar192 * auVar91._12_4_ * -0.5;
        auVar112._16_4_ = fVar166 * fVar166 * fVar166 * -0.0;
        auVar112._20_4_ = fVar182 * fVar182 * fVar182 * -0.0;
        auVar112._24_4_ = fVar83 * fVar83 * fVar83 * -0.0;
        auVar112._28_4_ = 0;
        auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar112 = vfmadd231ps_avx512vl(auVar112,auVar96,auVar111);
        auVar113._4_4_ = auVar115._4_4_ * auVar112._4_4_;
        auVar113._0_4_ = auVar115._0_4_ * auVar112._0_4_;
        auVar113._8_4_ = auVar115._8_4_ * auVar112._8_4_;
        auVar113._12_4_ = auVar115._12_4_ * auVar112._12_4_;
        auVar113._16_4_ = auVar115._16_4_ * auVar112._16_4_;
        auVar113._20_4_ = auVar115._20_4_ * auVar112._20_4_;
        auVar113._24_4_ = auVar115._24_4_ * auVar112._24_4_;
        auVar113._28_4_ = auVar111._28_4_;
        auVar111._4_4_ = auVar112._4_4_ * -auVar114._4_4_;
        auVar111._0_4_ = auVar112._0_4_ * -auVar114._0_4_;
        auVar111._8_4_ = auVar112._8_4_ * -auVar114._8_4_;
        auVar111._12_4_ = auVar112._12_4_ * -auVar114._12_4_;
        auVar111._16_4_ = auVar112._16_4_ * -auVar114._16_4_;
        auVar111._20_4_ = auVar112._20_4_ * -auVar114._20_4_;
        auVar111._24_4_ = auVar112._24_4_ * -auVar114._24_4_;
        auVar111._28_4_ = auVar114._28_4_ ^ 0x80000000;
        auVar104 = vmulps_avx512vl(auVar112,ZEXT1632(auVar93));
        auVar114 = ZEXT1632(auVar93);
        auVar110 = vfmadd213ps_avx512vl(auVar108,auVar108,auVar114);
        auVar91 = vfmadd231ps_fma(auVar110,auVar103,auVar103);
        auVar98 = vrsqrt14ps_avx512vl(ZEXT1632(auVar91));
        fVar183 = auVar98._0_4_;
        fVar190 = auVar98._4_4_;
        fVar191 = auVar98._8_4_;
        fVar192 = auVar98._12_4_;
        fVar166 = auVar98._16_4_;
        fVar182 = auVar98._20_4_;
        fVar83 = auVar98._24_4_;
        auVar110._4_4_ = fVar190 * fVar190 * fVar190 * auVar91._4_4_ * -0.5;
        auVar110._0_4_ = fVar183 * fVar183 * fVar183 * auVar91._0_4_ * -0.5;
        auVar110._8_4_ = fVar191 * fVar191 * fVar191 * auVar91._8_4_ * -0.5;
        auVar110._12_4_ = fVar192 * fVar192 * fVar192 * auVar91._12_4_ * -0.5;
        auVar110._16_4_ = fVar166 * fVar166 * fVar166 * -0.0;
        auVar110._20_4_ = fVar182 * fVar182 * fVar182 * -0.0;
        auVar110._24_4_ = fVar83 * fVar83 * fVar83 * -0.0;
        auVar110._28_4_ = 0;
        auVar110 = vfmadd231ps_avx512vl(auVar110,auVar96,auVar98);
        auVar97._4_4_ = auVar103._4_4_ * auVar110._4_4_;
        auVar97._0_4_ = auVar103._0_4_ * auVar110._0_4_;
        auVar97._8_4_ = auVar103._8_4_ * auVar110._8_4_;
        auVar97._12_4_ = auVar103._12_4_ * auVar110._12_4_;
        auVar97._16_4_ = auVar103._16_4_ * auVar110._16_4_;
        auVar97._20_4_ = auVar103._20_4_ * auVar110._20_4_;
        auVar97._24_4_ = auVar103._24_4_ * auVar110._24_4_;
        auVar97._28_4_ = auVar98._28_4_;
        auVar98._4_4_ = -auVar108._4_4_ * auVar110._4_4_;
        auVar98._0_4_ = -auVar108._0_4_ * auVar110._0_4_;
        auVar98._8_4_ = -auVar108._8_4_ * auVar110._8_4_;
        auVar98._12_4_ = -auVar108._12_4_ * auVar110._12_4_;
        auVar98._16_4_ = -auVar108._16_4_ * auVar110._16_4_;
        auVar98._20_4_ = -auVar108._20_4_ * auVar110._20_4_;
        auVar98._24_4_ = -auVar108._24_4_ * auVar110._24_4_;
        auVar98._28_4_ = auVar112._28_4_;
        auVar112 = vmulps_avx512vl(auVar110,auVar114);
        auVar91 = vfmadd213ps_fma(auVar113,auVar106,auVar99);
        auVar148 = vfmadd213ps_fma(auVar111,auVar106,auVar100);
        auVar110 = vfmadd213ps_avx512vl(auVar104,auVar106,auVar105);
        auVar96 = vfmadd213ps_avx512vl(auVar97,ZEXT1632(auVar147),auVar101);
        auVar92 = vfnmadd213ps_fma(auVar113,auVar106,auVar99);
        auVar99 = ZEXT1632(auVar147);
        auVar90 = vfmadd213ps_fma(auVar98,auVar99,auVar102);
        auVar88 = vfnmadd213ps_fma(auVar111,auVar106,auVar100);
        auVar20 = vfmadd213ps_fma(auVar112,auVar99,auVar109);
        auVar113 = vfnmadd231ps_avx512vl(auVar105,auVar106,auVar104);
        auVar86 = vfnmadd213ps_fma(auVar97,auVar99,auVar101);
        auVar85 = vfnmadd213ps_fma(auVar98,auVar99,auVar102);
        auVar145 = vfnmadd231ps_fma(auVar109,ZEXT1632(auVar147),auVar112);
        auVar111 = vsubps_avx512vl(auVar96,ZEXT1632(auVar92));
        auVar112 = vsubps_avx(ZEXT1632(auVar90),ZEXT1632(auVar88));
        auVar97 = vsubps_avx512vl(ZEXT1632(auVar20),auVar113);
        auVar98 = vmulps_avx512vl(auVar112,auVar113);
        auVar21 = vfmsub231ps_fma(auVar98,ZEXT1632(auVar88),auVar97);
        auVar109._4_4_ = auVar92._4_4_ * auVar97._4_4_;
        auVar109._0_4_ = auVar92._0_4_ * auVar97._0_4_;
        auVar109._8_4_ = auVar92._8_4_ * auVar97._8_4_;
        auVar109._12_4_ = auVar92._12_4_ * auVar97._12_4_;
        auVar109._16_4_ = auVar97._16_4_ * 0.0;
        auVar109._20_4_ = auVar97._20_4_ * 0.0;
        auVar109._24_4_ = auVar97._24_4_ * 0.0;
        auVar109._28_4_ = auVar97._28_4_;
        auVar97 = vfmsub231ps_avx512vl(auVar109,auVar113,auVar111);
        auVar99._4_4_ = auVar88._4_4_ * auVar111._4_4_;
        auVar99._0_4_ = auVar88._0_4_ * auVar111._0_4_;
        auVar99._8_4_ = auVar88._8_4_ * auVar111._8_4_;
        auVar99._12_4_ = auVar88._12_4_ * auVar111._12_4_;
        auVar99._16_4_ = auVar111._16_4_ * 0.0;
        auVar99._20_4_ = auVar111._20_4_ * 0.0;
        auVar99._24_4_ = auVar111._24_4_ * 0.0;
        auVar99._28_4_ = auVar111._28_4_;
        auVar22 = vfmsub231ps_fma(auVar99,ZEXT1632(auVar92),auVar112);
        auVar112 = vfmadd231ps_avx512vl(ZEXT1632(auVar22),auVar114,auVar97);
        auVar112 = vfmadd231ps_avx512vl(auVar112,auVar114,ZEXT1632(auVar21));
        auVar103 = ZEXT1632(auVar93);
        uVar73 = vcmpps_avx512vl(auVar112,auVar103,2);
        bVar72 = (byte)uVar73;
        fVar83 = (float)((uint)(bVar72 & 1) * auVar91._0_4_ |
                        (uint)!(bool)(bVar72 & 1) * auVar86._0_4_);
        bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
        fVar135 = (float)((uint)bVar13 * auVar91._4_4_ | (uint)!bVar13 * auVar86._4_4_);
        bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
        fVar137 = (float)((uint)bVar13 * auVar91._8_4_ | (uint)!bVar13 * auVar86._8_4_);
        bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
        fVar140 = (float)((uint)bVar13 * auVar91._12_4_ | (uint)!bVar13 * auVar86._12_4_);
        auVar98 = ZEXT1632(CONCAT412(fVar140,CONCAT48(fVar137,CONCAT44(fVar135,fVar83))));
        fVar84 = (float)((uint)(bVar72 & 1) * auVar148._0_4_ |
                        (uint)!(bool)(bVar72 & 1) * auVar85._0_4_);
        bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
        fVar136 = (float)((uint)bVar13 * auVar148._4_4_ | (uint)!bVar13 * auVar85._4_4_);
        bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
        fVar138 = (float)((uint)bVar13 * auVar148._8_4_ | (uint)!bVar13 * auVar85._8_4_);
        bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
        fVar141 = (float)((uint)bVar13 * auVar148._12_4_ | (uint)!bVar13 * auVar85._12_4_);
        auVar109 = ZEXT1632(CONCAT412(fVar141,CONCAT48(fVar138,CONCAT44(fVar136,fVar84))));
        auVar104._0_4_ =
             (float)((uint)(bVar72 & 1) * auVar110._0_4_ |
                    (uint)!(bool)(bVar72 & 1) * auVar145._0_4_);
        bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar104._4_4_ = (float)((uint)bVar13 * auVar110._4_4_ | (uint)!bVar13 * auVar145._4_4_);
        bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar104._8_4_ = (float)((uint)bVar13 * auVar110._8_4_ | (uint)!bVar13 * auVar145._8_4_);
        bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar104._12_4_ = (float)((uint)bVar13 * auVar110._12_4_ | (uint)!bVar13 * auVar145._12_4_);
        fVar183 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar110._16_4_);
        auVar104._16_4_ = fVar183;
        fVar190 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar110._20_4_);
        auVar104._20_4_ = fVar190;
        fVar191 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar110._24_4_);
        auVar104._24_4_ = fVar191;
        iVar1 = (uint)(byte)(uVar73 >> 7) * auVar110._28_4_;
        auVar104._28_4_ = iVar1;
        auVar111 = vblendmps_avx512vl(ZEXT1632(auVar92),auVar96);
        auVar116._0_4_ =
             (uint)(bVar72 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar21._0_4_;
        bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar116._4_4_ = (uint)bVar13 * auVar111._4_4_ | (uint)!bVar13 * auVar21._4_4_;
        bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar116._8_4_ = (uint)bVar13 * auVar111._8_4_ | (uint)!bVar13 * auVar21._8_4_;
        bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar116._12_4_ = (uint)bVar13 * auVar111._12_4_ | (uint)!bVar13 * auVar21._12_4_;
        auVar116._16_4_ = (uint)((byte)(uVar73 >> 4) & 1) * auVar111._16_4_;
        auVar116._20_4_ = (uint)((byte)(uVar73 >> 5) & 1) * auVar111._20_4_;
        auVar116._24_4_ = (uint)((byte)(uVar73 >> 6) & 1) * auVar111._24_4_;
        auVar116._28_4_ = (uint)(byte)(uVar73 >> 7) * auVar111._28_4_;
        auVar111 = vblendmps_avx512vl(ZEXT1632(auVar88),ZEXT1632(auVar90));
        auVar117._0_4_ =
             (float)((uint)(bVar72 & 1) * auVar111._0_4_ |
                    (uint)!(bool)(bVar72 & 1) * auVar148._0_4_);
        bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar117._4_4_ = (float)((uint)bVar13 * auVar111._4_4_ | (uint)!bVar13 * auVar148._4_4_);
        bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar117._8_4_ = (float)((uint)bVar13 * auVar111._8_4_ | (uint)!bVar13 * auVar148._8_4_);
        bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar117._12_4_ = (float)((uint)bVar13 * auVar111._12_4_ | (uint)!bVar13 * auVar148._12_4_);
        fVar192 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar111._16_4_);
        auVar117._16_4_ = fVar192;
        fVar166 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar111._20_4_);
        auVar117._20_4_ = fVar166;
        fVar182 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar111._24_4_);
        auVar117._24_4_ = fVar182;
        auVar117._28_4_ = (uint)(byte)(uVar73 >> 7) * auVar111._28_4_;
        auVar111 = vblendmps_avx512vl(auVar113,ZEXT1632(auVar20));
        auVar118._0_4_ =
             (float)((uint)(bVar72 & 1) * auVar111._0_4_ |
                    (uint)!(bool)(bVar72 & 1) * auVar110._0_4_);
        bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar118._4_4_ = (float)((uint)bVar13 * auVar111._4_4_ | (uint)!bVar13 * auVar110._4_4_);
        bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar118._8_4_ = (float)((uint)bVar13 * auVar111._8_4_ | (uint)!bVar13 * auVar110._8_4_);
        bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar118._12_4_ = (float)((uint)bVar13 * auVar111._12_4_ | (uint)!bVar13 * auVar110._12_4_);
        bVar13 = (bool)((byte)(uVar73 >> 4) & 1);
        auVar118._16_4_ = (float)((uint)bVar13 * auVar111._16_4_ | (uint)!bVar13 * auVar110._16_4_);
        bVar13 = (bool)((byte)(uVar73 >> 5) & 1);
        auVar118._20_4_ = (float)((uint)bVar13 * auVar111._20_4_ | (uint)!bVar13 * auVar110._20_4_);
        bVar13 = (bool)((byte)(uVar73 >> 6) & 1);
        auVar118._24_4_ = (float)((uint)bVar13 * auVar111._24_4_ | (uint)!bVar13 * auVar110._24_4_);
        bVar13 = SUB81(uVar73 >> 7,0);
        auVar118._28_4_ = (uint)bVar13 * auVar111._28_4_ | (uint)!bVar13 * auVar110._28_4_;
        auVar119._0_4_ =
             (uint)(bVar72 & 1) * (int)auVar92._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar96._0_4_;
        bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar119._4_4_ = (uint)bVar13 * (int)auVar92._4_4_ | (uint)!bVar13 * auVar96._4_4_;
        bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar119._8_4_ = (uint)bVar13 * (int)auVar92._8_4_ | (uint)!bVar13 * auVar96._8_4_;
        bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar119._12_4_ = (uint)bVar13 * (int)auVar92._12_4_ | (uint)!bVar13 * auVar96._12_4_;
        auVar119._16_4_ = (uint)!(bool)((byte)(uVar73 >> 4) & 1) * auVar96._16_4_;
        auVar119._20_4_ = (uint)!(bool)((byte)(uVar73 >> 5) & 1) * auVar96._20_4_;
        auVar119._24_4_ = (uint)!(bool)((byte)(uVar73 >> 6) & 1) * auVar96._24_4_;
        auVar119._28_4_ = (uint)!SUB81(uVar73 >> 7,0) * auVar96._28_4_;
        bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
        bVar15 = (bool)((byte)(uVar73 >> 2) & 1);
        bVar16 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar120._0_4_ =
             (uint)(bVar72 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar20._0_4_;
        bVar14 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar120._4_4_ = (uint)bVar14 * auVar113._4_4_ | (uint)!bVar14 * auVar20._4_4_;
        bVar14 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar120._8_4_ = (uint)bVar14 * auVar113._8_4_ | (uint)!bVar14 * auVar20._8_4_;
        bVar14 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar120._12_4_ = (uint)bVar14 * auVar113._12_4_ | (uint)!bVar14 * auVar20._12_4_;
        auVar120._16_4_ = (uint)((byte)(uVar73 >> 4) & 1) * auVar113._16_4_;
        auVar120._20_4_ = (uint)((byte)(uVar73 >> 5) & 1) * auVar113._20_4_;
        auVar120._24_4_ = (uint)((byte)(uVar73 >> 6) & 1) * auVar113._24_4_;
        iVar2 = (uint)(byte)(uVar73 >> 7) * auVar113._28_4_;
        auVar120._28_4_ = iVar2;
        auVar99 = vsubps_avx512vl(auVar119,auVar98);
        auVar113 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar88._12_4_ |
                                                 (uint)!bVar16 * auVar90._12_4_,
                                                 CONCAT48((uint)bVar15 * (int)auVar88._8_4_ |
                                                          (uint)!bVar15 * auVar90._8_4_,
                                                          CONCAT44((uint)bVar13 * (int)auVar88._4_4_
                                                                   | (uint)!bVar13 * auVar90._4_4_,
                                                                   (uint)(bVar72 & 1) *
                                                                   (int)auVar88._0_4_ |
                                                                   (uint)!(bool)(bVar72 & 1) *
                                                                   auVar90._0_4_)))),auVar109);
        auVar111 = vsubps_avx(auVar120,auVar104);
        auVar110 = vsubps_avx(auVar98,auVar116);
        auVar96 = vsubps_avx(auVar109,auVar117);
        auVar97 = vsubps_avx(auVar104,auVar118);
        auVar100._4_4_ = auVar111._4_4_ * fVar135;
        auVar100._0_4_ = auVar111._0_4_ * fVar83;
        auVar100._8_4_ = auVar111._8_4_ * fVar137;
        auVar100._12_4_ = auVar111._12_4_ * fVar140;
        auVar100._16_4_ = auVar111._16_4_ * 0.0;
        auVar100._20_4_ = auVar111._20_4_ * 0.0;
        auVar100._24_4_ = auVar111._24_4_ * 0.0;
        auVar100._28_4_ = iVar2;
        auVar91 = vfmsub231ps_fma(auVar100,auVar104,auVar99);
        auVar101._4_4_ = fVar136 * auVar99._4_4_;
        auVar101._0_4_ = fVar84 * auVar99._0_4_;
        auVar101._8_4_ = fVar138 * auVar99._8_4_;
        auVar101._12_4_ = fVar141 * auVar99._12_4_;
        auVar101._16_4_ = auVar99._16_4_ * 0.0;
        auVar101._20_4_ = auVar99._20_4_ * 0.0;
        auVar101._24_4_ = auVar99._24_4_ * 0.0;
        auVar101._28_4_ = auVar112._28_4_;
        auVar148 = vfmsub231ps_fma(auVar101,auVar98,auVar113);
        auVar112 = vfmadd231ps_avx512vl(ZEXT1632(auVar148),auVar103,ZEXT1632(auVar91));
        auVar186._0_4_ = auVar113._0_4_ * auVar104._0_4_;
        auVar186._4_4_ = auVar113._4_4_ * auVar104._4_4_;
        auVar186._8_4_ = auVar113._8_4_ * auVar104._8_4_;
        auVar186._12_4_ = auVar113._12_4_ * auVar104._12_4_;
        auVar186._16_4_ = auVar113._16_4_ * fVar183;
        auVar186._20_4_ = auVar113._20_4_ * fVar190;
        auVar186._24_4_ = auVar113._24_4_ * fVar191;
        auVar186._28_4_ = 0;
        auVar91 = vfmsub231ps_fma(auVar186,auVar109,auVar111);
        auVar100 = vfmadd231ps_avx512vl(auVar112,auVar103,ZEXT1632(auVar91));
        auVar112 = vmulps_avx512vl(auVar97,auVar116);
        auVar112 = vfmsub231ps_avx512vl(auVar112,auVar110,auVar118);
        auVar102._4_4_ = auVar96._4_4_ * auVar118._4_4_;
        auVar102._0_4_ = auVar96._0_4_ * auVar118._0_4_;
        auVar102._8_4_ = auVar96._8_4_ * auVar118._8_4_;
        auVar102._12_4_ = auVar96._12_4_ * auVar118._12_4_;
        auVar102._16_4_ = auVar96._16_4_ * auVar118._16_4_;
        auVar102._20_4_ = auVar96._20_4_ * auVar118._20_4_;
        auVar102._24_4_ = auVar96._24_4_ * auVar118._24_4_;
        auVar102._28_4_ = auVar118._28_4_;
        auVar91 = vfmsub231ps_fma(auVar102,auVar117,auVar97);
        auVar187._0_4_ = auVar117._0_4_ * auVar110._0_4_;
        auVar187._4_4_ = auVar117._4_4_ * auVar110._4_4_;
        auVar187._8_4_ = auVar117._8_4_ * auVar110._8_4_;
        auVar187._12_4_ = auVar117._12_4_ * auVar110._12_4_;
        auVar187._16_4_ = fVar192 * auVar110._16_4_;
        auVar187._20_4_ = fVar166 * auVar110._20_4_;
        auVar187._24_4_ = fVar182 * auVar110._24_4_;
        auVar187._28_4_ = 0;
        auVar148 = vfmsub231ps_fma(auVar187,auVar96,auVar116);
        auVar112 = vfmadd231ps_avx512vl(ZEXT1632(auVar148),auVar103,auVar112);
        auVar101 = vfmadd231ps_avx512vl(auVar112,auVar103,ZEXT1632(auVar91));
        auVar112 = vmaxps_avx(auVar100,auVar101);
        uVar158 = vcmpps_avx512vl(auVar112,auVar103,2);
        bVar82 = bVar82 & (byte)uVar158;
        in_ZMM20 = ZEXT3264(local_520);
        in_ZMM21 = ZEXT3264(local_540);
        auVar219 = ZEXT3264(local_480);
        auVar217 = ZEXT3264(local_5e0);
        if (bVar82 == 0) {
          bVar82 = 0;
          auVar203 = ZEXT3264(auVar179);
          auVar181 = ZEXT3264(auVar121);
        }
        else {
          auVar35._4_4_ = auVar97._4_4_ * auVar113._4_4_;
          auVar35._0_4_ = auVar97._0_4_ * auVar113._0_4_;
          auVar35._8_4_ = auVar97._8_4_ * auVar113._8_4_;
          auVar35._12_4_ = auVar97._12_4_ * auVar113._12_4_;
          auVar35._16_4_ = auVar97._16_4_ * auVar113._16_4_;
          auVar35._20_4_ = auVar97._20_4_ * auVar113._20_4_;
          auVar35._24_4_ = auVar97._24_4_ * auVar113._24_4_;
          auVar35._28_4_ = auVar112._28_4_;
          auVar90 = vfmsub231ps_fma(auVar35,auVar96,auVar111);
          auVar36._4_4_ = auVar111._4_4_ * auVar110._4_4_;
          auVar36._0_4_ = auVar111._0_4_ * auVar110._0_4_;
          auVar36._8_4_ = auVar111._8_4_ * auVar110._8_4_;
          auVar36._12_4_ = auVar111._12_4_ * auVar110._12_4_;
          auVar36._16_4_ = auVar111._16_4_ * auVar110._16_4_;
          auVar36._20_4_ = auVar111._20_4_ * auVar110._20_4_;
          auVar36._24_4_ = auVar111._24_4_ * auVar110._24_4_;
          auVar36._28_4_ = auVar111._28_4_;
          auVar148 = vfmsub231ps_fma(auVar36,auVar99,auVar97);
          auVar37._4_4_ = auVar96._4_4_ * auVar99._4_4_;
          auVar37._0_4_ = auVar96._0_4_ * auVar99._0_4_;
          auVar37._8_4_ = auVar96._8_4_ * auVar99._8_4_;
          auVar37._12_4_ = auVar96._12_4_ * auVar99._12_4_;
          auVar37._16_4_ = auVar96._16_4_ * auVar99._16_4_;
          auVar37._20_4_ = auVar96._20_4_ * auVar99._20_4_;
          auVar37._24_4_ = auVar96._24_4_ * auVar99._24_4_;
          auVar37._28_4_ = auVar96._28_4_;
          auVar20 = vfmsub231ps_fma(auVar37,auVar110,auVar113);
          auVar91 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar148),ZEXT1632(auVar20));
          auVar112 = vfmadd231ps_avx512vl(ZEXT1632(auVar91),ZEXT1632(auVar90),auVar103);
          auVar113 = vrcp14ps_avx512vl(auVar112);
          auVar26._8_4_ = 0x3f800000;
          auVar26._0_8_ = &DAT_3f8000003f800000;
          auVar26._12_4_ = 0x3f800000;
          auVar26._16_4_ = 0x3f800000;
          auVar26._20_4_ = 0x3f800000;
          auVar26._24_4_ = 0x3f800000;
          auVar26._28_4_ = 0x3f800000;
          auVar111 = vfnmadd213ps_avx512vl(auVar113,auVar112,auVar26);
          auVar91 = vfmadd132ps_fma(auVar111,auVar113,auVar113);
          auVar38._4_4_ = auVar20._4_4_ * auVar104._4_4_;
          auVar38._0_4_ = auVar20._0_4_ * auVar104._0_4_;
          auVar38._8_4_ = auVar20._8_4_ * auVar104._8_4_;
          auVar38._12_4_ = auVar20._12_4_ * auVar104._12_4_;
          auVar38._16_4_ = fVar183 * 0.0;
          auVar38._20_4_ = fVar190 * 0.0;
          auVar38._24_4_ = fVar191 * 0.0;
          auVar38._28_4_ = iVar1;
          auVar148 = vfmadd231ps_fma(auVar38,auVar109,ZEXT1632(auVar148));
          auVar148 = vfmadd231ps_fma(ZEXT1632(auVar148),auVar98,ZEXT1632(auVar90));
          fVar183 = auVar91._0_4_;
          fVar190 = auVar91._4_4_;
          fVar191 = auVar91._8_4_;
          fVar192 = auVar91._12_4_;
          auVar113 = ZEXT1632(CONCAT412(auVar148._12_4_ * fVar192,
                                        CONCAT48(auVar148._8_4_ * fVar191,
                                                 CONCAT44(auVar148._4_4_ * fVar190,
                                                          auVar148._0_4_ * fVar183))));
          auVar206._4_4_ = uVar77;
          auVar206._0_4_ = uVar77;
          auVar206._8_4_ = uVar77;
          auVar206._12_4_ = uVar77;
          auVar206._16_4_ = uVar77;
          auVar206._20_4_ = uVar77;
          auVar206._24_4_ = uVar77;
          auVar206._28_4_ = uVar77;
          uVar158 = vcmpps_avx512vl(auVar206,auVar113,2);
          uVar144 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar27._4_4_ = uVar144;
          auVar27._0_4_ = uVar144;
          auVar27._8_4_ = uVar144;
          auVar27._12_4_ = uVar144;
          auVar27._16_4_ = uVar144;
          auVar27._20_4_ = uVar144;
          auVar27._24_4_ = uVar144;
          auVar27._28_4_ = uVar144;
          uVar23 = vcmpps_avx512vl(auVar113,auVar27,2);
          bVar82 = (byte)uVar158 & (byte)uVar23 & bVar82;
          if (bVar82 == 0) {
            bVar82 = 0;
            auVar203 = ZEXT3264(auVar179);
            auVar181 = ZEXT3264(auVar121);
          }
          else {
            uVar158 = vcmpps_avx512vl(auVar112,auVar103,4);
            if ((bVar82 & (byte)uVar158) == 0) {
              bVar82 = 0;
              auVar203 = ZEXT3264(auVar179);
              auVar181 = ZEXT3264(auVar121);
            }
            else {
              bVar82 = bVar82 & (byte)uVar158;
              fVar166 = auVar100._0_4_ * fVar183;
              fVar182 = auVar100._4_4_ * fVar190;
              auVar121._4_4_ = fVar182;
              auVar121._0_4_ = fVar166;
              fVar83 = auVar100._8_4_ * fVar191;
              auVar121._8_4_ = fVar83;
              fVar84 = auVar100._12_4_ * fVar192;
              auVar121._12_4_ = fVar84;
              fVar135 = auVar100._16_4_ * 0.0;
              auVar121._16_4_ = fVar135;
              fVar136 = auVar100._20_4_ * 0.0;
              auVar121._20_4_ = fVar136;
              fVar137 = auVar100._24_4_ * 0.0;
              auVar121._24_4_ = fVar137;
              auVar121._28_4_ = auVar100._28_4_;
              fVar183 = auVar101._0_4_ * fVar183;
              fVar190 = auVar101._4_4_ * fVar190;
              auVar179._4_4_ = fVar190;
              auVar179._0_4_ = fVar183;
              fVar191 = auVar101._8_4_ * fVar191;
              auVar179._8_4_ = fVar191;
              fVar192 = auVar101._12_4_ * fVar192;
              auVar179._12_4_ = fVar192;
              fVar138 = auVar101._16_4_ * 0.0;
              auVar179._16_4_ = fVar138;
              fVar140 = auVar101._20_4_ * 0.0;
              auVar179._20_4_ = fVar140;
              fVar141 = auVar101._24_4_ * 0.0;
              auVar179._24_4_ = fVar141;
              auVar179._28_4_ = auVar101._28_4_;
              auVar198._8_4_ = 0x3f800000;
              auVar198._0_8_ = &DAT_3f8000003f800000;
              auVar198._12_4_ = 0x3f800000;
              auVar198._16_4_ = 0x3f800000;
              auVar198._20_4_ = 0x3f800000;
              auVar198._24_4_ = 0x3f800000;
              auVar198._28_4_ = 0x3f800000;
              auVar121 = vsubps_avx(auVar198,auVar121);
              bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
              bVar14 = (bool)((byte)(uVar73 >> 2) & 1);
              bVar15 = (bool)((byte)(uVar73 >> 3) & 1);
              bVar16 = (bool)((byte)(uVar73 >> 4) & 1);
              bVar17 = (bool)((byte)(uVar73 >> 5) & 1);
              bVar18 = (bool)((byte)(uVar73 >> 6) & 1);
              bVar19 = SUB81(uVar73 >> 7,0);
              auVar203 = ZEXT3264(CONCAT428((uint)bVar19 * auVar100._28_4_ |
                                            (uint)!bVar19 * auVar121._28_4_,
                                            CONCAT424((uint)bVar18 * (int)fVar137 |
                                                      (uint)!bVar18 * auVar121._24_4_,
                                                      CONCAT420((uint)bVar17 * (int)fVar136 |
                                                                (uint)!bVar17 * auVar121._20_4_,
                                                                CONCAT416((uint)bVar16 *
                                                                          (int)fVar135 |
                                                                          (uint)!bVar16 *
                                                                          auVar121._16_4_,
                                                                          CONCAT412((uint)bVar15 *
                                                                                    (int)fVar84 |
                                                                                    (uint)!bVar15 *
                                                                                    auVar121._12_4_,
                                                                                    CONCAT48((uint)
                                                  bVar14 * (int)fVar83 |
                                                  (uint)!bVar14 * auVar121._8_4_,
                                                  CONCAT44((uint)bVar13 * (int)fVar182 |
                                                           (uint)!bVar13 * auVar121._4_4_,
                                                           (uint)(bVar72 & 1) * (int)fVar166 |
                                                           (uint)!(bool)(bVar72 & 1) *
                                                           auVar121._0_4_))))))));
              auVar121 = vsubps_avx(auVar198,auVar179);
              bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
              bVar14 = (bool)((byte)(uVar73 >> 2) & 1);
              bVar15 = (bool)((byte)(uVar73 >> 3) & 1);
              bVar16 = (bool)((byte)(uVar73 >> 4) & 1);
              bVar17 = (bool)((byte)(uVar73 >> 5) & 1);
              bVar18 = (bool)((byte)(uVar73 >> 6) & 1);
              bVar19 = SUB81(uVar73 >> 7,0);
              local_200._4_4_ = (uint)bVar13 * (int)fVar190 | (uint)!bVar13 * auVar121._4_4_;
              local_200._0_4_ =
                   (uint)(bVar72 & 1) * (int)fVar183 | (uint)!(bool)(bVar72 & 1) * auVar121._0_4_;
              local_200._8_4_ = (uint)bVar14 * (int)fVar191 | (uint)!bVar14 * auVar121._8_4_;
              local_200._12_4_ = (uint)bVar15 * (int)fVar192 | (uint)!bVar15 * auVar121._12_4_;
              local_200._16_4_ = (uint)bVar16 * (int)fVar138 | (uint)!bVar16 * auVar121._16_4_;
              local_200._20_4_ = (uint)bVar17 * (int)fVar140 | (uint)!bVar17 * auVar121._20_4_;
              local_200._24_4_ = (uint)bVar18 * (int)fVar141 | (uint)!bVar18 * auVar121._24_4_;
              local_200._28_4_ = (uint)bVar19 * auVar101._28_4_ | (uint)!bVar19 * auVar121._28_4_;
              auVar181 = ZEXT3264(auVar113);
            }
          }
        }
        auVar222 = ZEXT3264(local_580);
        auVar221 = ZEXT3264(local_560);
        if (bVar82 != 0) {
          auVar121 = vsubps_avx(ZEXT1632(auVar147),auVar106);
          auVar112 = auVar203._0_32_;
          auVar91 = vfmadd213ps_fma(auVar121,auVar112,auVar106);
          uVar144 = *(undefined4 *)((long)local_658->ray_space + k * 4 + -0x10);
          auVar106._4_4_ = uVar144;
          auVar106._0_4_ = uVar144;
          auVar106._8_4_ = uVar144;
          auVar106._12_4_ = uVar144;
          auVar106._16_4_ = uVar144;
          auVar106._20_4_ = uVar144;
          auVar106._24_4_ = uVar144;
          auVar106._28_4_ = uVar144;
          auVar121 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar91._12_4_ + auVar91._12_4_,
                                                        CONCAT48(auVar91._8_4_ + auVar91._8_4_,
                                                                 CONCAT44(auVar91._4_4_ +
                                                                          auVar91._4_4_,
                                                                          auVar91._0_4_ +
                                                                          auVar91._0_4_)))),auVar106
                                    );
          auVar179 = auVar181._0_32_;
          uVar158 = vcmpps_avx512vl(auVar179,auVar121,6);
          bVar82 = bVar82 & (byte)uVar158;
          if (bVar82 != 0) {
            auVar151._8_4_ = 0xbf800000;
            auVar151._0_8_ = 0xbf800000bf800000;
            auVar151._12_4_ = 0xbf800000;
            auVar151._16_4_ = 0xbf800000;
            auVar151._20_4_ = 0xbf800000;
            auVar151._24_4_ = 0xbf800000;
            auVar151._28_4_ = 0xbf800000;
            auVar28._8_4_ = 0x40000000;
            auVar28._0_8_ = 0x4000000040000000;
            auVar28._12_4_ = 0x40000000;
            auVar28._16_4_ = 0x40000000;
            auVar28._20_4_ = 0x40000000;
            auVar28._24_4_ = 0x40000000;
            auVar28._28_4_ = 0x40000000;
            local_3c0 = vfmadd132ps_avx512vl(local_200,auVar151,auVar28);
            local_200 = local_3c0;
            auVar121 = local_200;
            local_380 = 0;
            local_200 = auVar121;
            if ((pGVar78->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              fVar183 = 1.0 / auVar107._0_4_;
              local_320[0] = fVar183 * (auVar203._0_4_ + 0.0);
              local_320[1] = fVar183 * (auVar203._4_4_ + 1.0);
              local_320[2] = fVar183 * (auVar203._8_4_ + 2.0);
              local_320[3] = fVar183 * (auVar203._12_4_ + 3.0);
              fStack_310 = fVar183 * (auVar203._16_4_ + 4.0);
              fStack_30c = fVar183 * (auVar203._20_4_ + 5.0);
              fStack_308 = fVar183 * (auVar203._24_4_ + 6.0);
              fStack_304 = auVar203._28_4_ + 7.0;
              local_200._0_8_ = local_3c0._0_8_;
              local_200._8_8_ = local_3c0._8_8_;
              local_200._16_8_ = local_3c0._16_8_;
              local_200._24_8_ = local_3c0._24_8_;
              local_300 = local_200._0_8_;
              uStack_2f8 = local_200._8_8_;
              uStack_2f0 = local_200._16_8_;
              uStack_2e8 = local_200._24_8_;
              local_2e0 = auVar179;
              auVar152._8_4_ = 0x7f800000;
              auVar152._0_8_ = 0x7f8000007f800000;
              auVar152._12_4_ = 0x7f800000;
              auVar152._16_4_ = 0x7f800000;
              auVar152._20_4_ = 0x7f800000;
              auVar152._24_4_ = 0x7f800000;
              auVar152._28_4_ = 0x7f800000;
              auVar121 = vblendmps_avx512vl(auVar152,auVar179);
              auVar122._0_4_ =
                   (uint)(bVar82 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar82 & 1) * 0x7f800000;
              bVar13 = (bool)(bVar82 >> 1 & 1);
              auVar122._4_4_ = (uint)bVar13 * auVar121._4_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar82 >> 2 & 1);
              auVar122._8_4_ = (uint)bVar13 * auVar121._8_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar82 >> 3 & 1);
              auVar122._12_4_ = (uint)bVar13 * auVar121._12_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar82 >> 4 & 1);
              auVar122._16_4_ = (uint)bVar13 * auVar121._16_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar82 >> 5 & 1);
              auVar122._20_4_ = (uint)bVar13 * auVar121._20_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar82 >> 6 & 1);
              auVar122._24_4_ = (uint)bVar13 * auVar121._24_4_ | (uint)!bVar13 * 0x7f800000;
              auVar122._28_4_ =
                   (uint)(bVar82 >> 7) * auVar121._28_4_ | (uint)!(bool)(bVar82 >> 7) * 0x7f800000;
              auVar121 = vshufps_avx(auVar122,auVar122,0xb1);
              auVar121 = vminps_avx(auVar122,auVar121);
              auVar113 = vshufpd_avx(auVar121,auVar121,5);
              auVar121 = vminps_avx(auVar121,auVar113);
              auVar113 = vpermpd_avx2(auVar121,0x4e);
              auVar121 = vminps_avx(auVar121,auVar113);
              uVar158 = vcmpps_avx512vl(auVar122,auVar121,0);
              bVar71 = (byte)uVar158 & bVar82;
              bVar72 = bVar82;
              if (bVar71 != 0) {
                bVar72 = bVar71;
              }
              uVar75 = 0;
              for (uVar74 = (uint)bVar72; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x80000000) {
                uVar75 = uVar75 + 1;
              }
              uVar73 = (ulong)uVar75;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar78->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar183 = local_320[uVar73];
                uVar144 = *(undefined4 *)((long)&local_300 + uVar73 * 4);
                fVar190 = 1.0 - fVar183;
                auVar90 = vfnmadd231ss_fma(ZEXT416((uint)(fVar183 * (fVar190 + fVar190))),
                                           ZEXT416((uint)fVar190),ZEXT416((uint)fVar190));
                auVar147 = ZEXT416((uint)fVar183);
                auVar91 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar147,
                                          ZEXT416(0xc0a00000));
                auVar148 = vfmadd231ss_fma(ZEXT416((uint)(fVar183 * fVar183 * 3.0)),
                                           ZEXT416((uint)(fVar183 + fVar183)),auVar91);
                auVar91 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar147,
                                          ZEXT416(0x40000000));
                auVar91 = vfmadd231ss_fma(ZEXT416((uint)(fVar190 * fVar190 * -3.0)),
                                          ZEXT416((uint)(fVar190 + fVar190)),auVar91);
                auVar147 = vfmadd231ss_fma(ZEXT416((uint)(fVar183 * fVar183)),auVar147,
                                           ZEXT416((uint)(fVar190 * -2.0)));
                fVar190 = auVar90._0_4_ * 0.5;
                fVar191 = auVar148._0_4_ * 0.5;
                fVar192 = auVar91._0_4_ * 0.5;
                auVar203 = ZEXT3264(auVar112);
                fVar166 = auVar147._0_4_ * 0.5;
                auVar171._0_4_ = fVar166 * local_600;
                auVar171._4_4_ = fVar166 * fStack_5fc;
                auVar171._8_4_ = fVar166 * fStack_5f8;
                auVar171._12_4_ = fVar166 * fStack_5f4;
                auVar194._4_4_ = fVar192;
                auVar194._0_4_ = fVar192;
                auVar194._8_4_ = fVar192;
                auVar194._12_4_ = fVar192;
                auVar91 = vfmadd132ps_fma(auVar194,auVar171,*pauVar4);
                auVar172._4_4_ = fVar191;
                auVar172._0_4_ = fVar191;
                auVar172._8_4_ = fVar191;
                auVar172._12_4_ = fVar191;
                auVar91 = vfmadd132ps_fma(auVar172,auVar91,*pauVar3);
                auVar164._4_4_ = fVar190;
                auVar164._0_4_ = fVar190;
                auVar164._8_4_ = fVar190;
                auVar164._12_4_ = fVar190;
                auVar91 = vfmadd213ps_fma(auVar164,auVar89,auVar91);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2e0 + uVar73 * 4);
                auVar181 = ZEXT3264(auVar179);
                *(int *)(ray + k * 4 + 0xc0) = auVar91._0_4_;
                uVar11 = vextractps_avx(auVar91,1);
                *(undefined4 *)(ray + k * 4 + 0xd0) = uVar11;
                uVar11 = vextractps_avx(auVar91,2);
                *(undefined4 *)(ray + k * 4 + 0xe0) = uVar11;
                *(float *)(ray + k * 4 + 0xf0) = fVar183;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar144;
                *(uint *)(ray + k * 4 + 0x110) = uVar9;
                *(uint *)(ray + k * 4 + 0x120) = uVar79;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              }
              else {
                local_4d0 = vpbroadcastd_avx512vl();
                local_590 = vpbroadcastd_avx512vl();
                local_4e0 = (undefined4)local_640;
                uStack_4dc = (undefined4)((ulong)local_640 >> 0x20);
                local_500 = local_600;
                fStack_4fc = fStack_5fc;
                fStack_4f8 = fStack_5f8;
                fStack_4f4 = fStack_5f4;
                local_4f0 = local_650;
                uStack_4e8 = uStack_648;
                uStack_4d8 = uStack_638;
                local_3e0 = auVar112;
                local_3a0 = auVar179;
                local_37c = iVar10;
                local_370 = auVar89;
                local_360 = local_640;
                uStack_358 = uStack_638;
                local_350 = local_650;
                uStack_348 = uStack_648;
                local_330 = bVar82;
                do {
                  auVar90 = auVar220._0_16_;
                  local_4c0._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                  fVar183 = local_320[uVar73];
                  local_280._4_4_ = fVar183;
                  local_280._0_4_ = fVar183;
                  local_280._8_4_ = fVar183;
                  local_280._12_4_ = fVar183;
                  local_270 = *(undefined4 *)((long)&local_300 + uVar73 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2e0 + uVar73 * 4);
                  local_630.context = context->user;
                  fVar190 = 1.0 - fVar183;
                  auVar147 = vfnmadd231ss_fma(ZEXT416((uint)(fVar183 * (fVar190 + fVar190))),
                                              ZEXT416((uint)fVar190),ZEXT416((uint)fVar190));
                  auVar87 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_280,
                                            ZEXT416(0xc0a00000));
                  auVar91 = vfmadd231ss_fma(ZEXT416((uint)(fVar183 * fVar183 * 3.0)),
                                            ZEXT416((uint)(fVar183 + fVar183)),auVar87);
                  auVar87 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_280,
                                            ZEXT416(0x40000000));
                  auVar87 = vfmadd231ss_fma(ZEXT416((uint)(fVar190 * fVar190 * -3.0)),
                                            ZEXT416((uint)(fVar190 + fVar190)),auVar87);
                  auVar148 = vfmadd231ss_fma(ZEXT416((uint)(fVar183 * fVar183)),local_280,
                                             ZEXT416((uint)(fVar190 * -2.0)));
                  fVar183 = auVar147._0_4_ * 0.5;
                  fVar190 = auVar91._0_4_ * 0.5;
                  fVar191 = auVar87._0_4_ * 0.5;
                  fVar192 = auVar148._0_4_ * 0.5;
                  auVar177._0_4_ = fVar192 * local_500;
                  auVar177._4_4_ = fVar192 * fStack_4fc;
                  auVar177._8_4_ = fVar192 * fStack_4f8;
                  auVar177._12_4_ = fVar192 * fStack_4f4;
                  auVar197._4_4_ = fVar191;
                  auVar197._0_4_ = fVar191;
                  auVar197._8_4_ = fVar191;
                  auVar197._12_4_ = fVar191;
                  auVar68._8_8_ = uStack_4e8;
                  auVar68._0_8_ = local_4f0;
                  auVar87 = vfmadd132ps_fma(auVar197,auVar177,auVar68);
                  auVar178._4_4_ = fVar190;
                  auVar178._0_4_ = fVar190;
                  auVar178._8_4_ = fVar190;
                  auVar178._12_4_ = fVar190;
                  auVar69._4_4_ = uStack_4dc;
                  auVar69._0_4_ = local_4e0;
                  auVar69._8_8_ = uStack_4d8;
                  auVar87 = vfmadd132ps_fma(auVar178,auVar87,auVar69);
                  auVar150._4_4_ = fVar183;
                  auVar150._0_4_ = fVar183;
                  auVar150._8_4_ = fVar183;
                  auVar150._12_4_ = fVar183;
                  auVar87 = vfmadd213ps_fma(auVar150,auVar89,auVar87);
                  local_2b0 = auVar87._0_4_;
                  local_2a0 = vshufps_avx(auVar87,auVar87,0x55);
                  local_290 = vshufps_avx(auVar87,auVar87,0xaa);
                  iStack_2ac = local_2b0;
                  iStack_2a8 = local_2b0;
                  iStack_2a4 = local_2b0;
                  uStack_26c = local_270;
                  uStack_268 = local_270;
                  uStack_264 = local_270;
                  local_260 = local_590._0_8_;
                  uStack_258 = local_590._8_8_;
                  local_250 = local_4d0;
                  vpcmpeqd_avx2(ZEXT1632(local_4d0),ZEXT1632(local_4d0));
                  uStack_23c = (local_630.context)->instID[0];
                  local_240 = uStack_23c;
                  uStack_238 = uStack_23c;
                  uStack_234 = uStack_23c;
                  uStack_230 = (local_630.context)->instPrimID[0];
                  uStack_22c = uStack_230;
                  uStack_228 = uStack_230;
                  uStack_224 = uStack_230;
                  local_670 = local_430._0_8_;
                  uStack_668 = local_430._8_8_;
                  local_630.valid = (int *)&local_670;
                  local_630.geometryUserPtr = pGVar78->userPtr;
                  local_630.hit = (RTCHitN *)&local_2b0;
                  local_630.N = 4;
                  local_420 = (uint)uVar73;
                  uStack_41c = (uint)(uVar73 >> 0x20);
                  local_630.ray = (RTCRayN *)ray;
                  if (pGVar78->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar78->intersectionFilterN)(&local_630);
                    uVar73 = CONCAT44(uStack_41c,local_420);
                    auVar223 = ZEXT1664(local_460._0_16_);
                    auVar222 = ZEXT3264(local_580);
                    auVar221 = ZEXT3264(local_560);
                    auVar217 = ZEXT3264(local_5e0);
                    auVar218 = ZEXT3264(local_5c0);
                    auVar219 = ZEXT3264(local_480);
                    in_ZMM21 = ZEXT3264(local_540);
                    in_ZMM20 = ZEXT3264(local_520);
                    auVar87 = vxorps_avx512vl(auVar90,auVar90);
                    auVar220 = ZEXT1664(auVar87);
                    uVar77 = local_4a0._0_4_;
                  }
                  auVar87 = auVar220._0_16_;
                  auVar61._8_8_ = uStack_668;
                  auVar61._0_8_ = local_670;
                  uVar76 = vptestmd_avx512vl(auVar61,auVar61);
                  if ((uVar76 & 0xf) == 0) {
LAB_01b63e63:
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_4c0._0_4_;
                  }
                  else {
                    p_Var12 = context->args->filter;
                    if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar78->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var12)(&local_630);
                      uVar73 = CONCAT44(uStack_41c,local_420);
                      auVar223 = ZEXT1664(local_460._0_16_);
                      auVar222 = ZEXT3264(local_580);
                      auVar221 = ZEXT3264(local_560);
                      auVar217 = ZEXT3264(local_5e0);
                      auVar218 = ZEXT3264(local_5c0);
                      auVar219 = ZEXT3264(local_480);
                      in_ZMM21 = ZEXT3264(local_540);
                      in_ZMM20 = ZEXT3264(local_520);
                      auVar87 = vxorps_avx512vl(auVar87,auVar87);
                      auVar220 = ZEXT1664(auVar87);
                      uVar77 = local_4a0._0_4_;
                    }
                    auVar62._8_8_ = uStack_668;
                    auVar62._0_8_ = local_670;
                    uVar76 = vptestmd_avx512vl(auVar62,auVar62);
                    uVar76 = uVar76 & 0xf;
                    bVar72 = (byte)uVar76;
                    if (bVar72 == 0) goto LAB_01b63e63;
                    iVar1 = *(int *)(local_630.hit + 4);
                    iVar2 = *(int *)(local_630.hit + 8);
                    iVar58 = *(int *)(local_630.hit + 0xc);
                    bVar13 = (bool)((byte)(uVar76 >> 1) & 1);
                    bVar14 = (bool)((byte)(uVar76 >> 2) & 1);
                    bVar15 = SUB81(uVar76 >> 3,0);
                    *(uint *)(local_630.ray + 0xc0) =
                         (uint)(bVar72 & 1) * *(int *)local_630.hit |
                         (uint)!(bool)(bVar72 & 1) * *(int *)(local_630.ray + 0xc0);
                    *(uint *)(local_630.ray + 0xc4) =
                         (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_630.ray + 0xc4);
                    *(uint *)(local_630.ray + 200) =
                         (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_630.ray + 200);
                    *(uint *)(local_630.ray + 0xcc) =
                         (uint)bVar15 * iVar58 | (uint)!bVar15 * *(int *)(local_630.ray + 0xcc);
                    iVar1 = *(int *)(local_630.hit + 0x14);
                    iVar2 = *(int *)(local_630.hit + 0x18);
                    iVar58 = *(int *)(local_630.hit + 0x1c);
                    bVar13 = (bool)((byte)(uVar76 >> 1) & 1);
                    bVar14 = (bool)((byte)(uVar76 >> 2) & 1);
                    bVar15 = SUB81(uVar76 >> 3,0);
                    *(uint *)(local_630.ray + 0xd0) =
                         (uint)(bVar72 & 1) * *(int *)(local_630.hit + 0x10) |
                         (uint)!(bool)(bVar72 & 1) * *(int *)(local_630.ray + 0xd0);
                    *(uint *)(local_630.ray + 0xd4) =
                         (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_630.ray + 0xd4);
                    *(uint *)(local_630.ray + 0xd8) =
                         (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_630.ray + 0xd8);
                    *(uint *)(local_630.ray + 0xdc) =
                         (uint)bVar15 * iVar58 | (uint)!bVar15 * *(int *)(local_630.ray + 0xdc);
                    iVar1 = *(int *)(local_630.hit + 0x24);
                    iVar2 = *(int *)(local_630.hit + 0x28);
                    iVar58 = *(int *)(local_630.hit + 0x2c);
                    bVar13 = (bool)((byte)(uVar76 >> 1) & 1);
                    bVar14 = (bool)((byte)(uVar76 >> 2) & 1);
                    bVar15 = SUB81(uVar76 >> 3,0);
                    *(uint *)(local_630.ray + 0xe0) =
                         (uint)(bVar72 & 1) * *(int *)(local_630.hit + 0x20) |
                         (uint)!(bool)(bVar72 & 1) * *(int *)(local_630.ray + 0xe0);
                    *(uint *)(local_630.ray + 0xe4) =
                         (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_630.ray + 0xe4);
                    *(uint *)(local_630.ray + 0xe8) =
                         (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_630.ray + 0xe8);
                    *(uint *)(local_630.ray + 0xec) =
                         (uint)bVar15 * iVar58 | (uint)!bVar15 * *(int *)(local_630.ray + 0xec);
                    iVar1 = *(int *)(local_630.hit + 0x34);
                    iVar2 = *(int *)(local_630.hit + 0x38);
                    iVar58 = *(int *)(local_630.hit + 0x3c);
                    bVar13 = (bool)((byte)(uVar76 >> 1) & 1);
                    bVar14 = (bool)((byte)(uVar76 >> 2) & 1);
                    bVar15 = SUB81(uVar76 >> 3,0);
                    *(uint *)(local_630.ray + 0xf0) =
                         (uint)(bVar72 & 1) * *(int *)(local_630.hit + 0x30) |
                         (uint)!(bool)(bVar72 & 1) * *(int *)(local_630.ray + 0xf0);
                    *(uint *)(local_630.ray + 0xf4) =
                         (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_630.ray + 0xf4);
                    *(uint *)(local_630.ray + 0xf8) =
                         (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_630.ray + 0xf8);
                    *(uint *)(local_630.ray + 0xfc) =
                         (uint)bVar15 * iVar58 | (uint)!bVar15 * *(int *)(local_630.ray + 0xfc);
                    auVar87 = *(undefined1 (*) [16])(local_630.ray + 0x100);
                    auVar95._0_4_ =
                         (uint)(bVar72 & 1) * *(int *)(local_630.hit + 0x40) |
                         (uint)!(bool)(bVar72 & 1) * auVar87._0_4_;
                    bVar13 = (bool)((byte)(uVar76 >> 1) & 1);
                    auVar95._4_4_ =
                         (uint)bVar13 * *(int *)(local_630.hit + 0x44) |
                         (uint)!bVar13 * auVar87._4_4_;
                    bVar13 = (bool)((byte)(uVar76 >> 2) & 1);
                    auVar95._8_4_ =
                         (uint)bVar13 * *(int *)(local_630.hit + 0x48) |
                         (uint)!bVar13 * auVar87._8_4_;
                    bVar13 = SUB81(uVar76 >> 3,0);
                    auVar95._12_4_ =
                         (uint)bVar13 * *(int *)(local_630.hit + 0x4c) |
                         (uint)!bVar13 * auVar87._12_4_;
                    *(undefined1 (*) [16])(local_630.ray + 0x100) = auVar95;
                    auVar87 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_630.hit + 0x50));
                    *(undefined1 (*) [16])(local_630.ray + 0x110) = auVar87;
                    auVar87 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_630.hit + 0x60));
                    *(undefined1 (*) [16])(local_630.ray + 0x120) = auVar87;
                    auVar87 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_630.hit + 0x70));
                    *(undefined1 (*) [16])(local_630.ray + 0x130) = auVar87;
                    auVar87 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_630.hit + 0x80));
                    *(undefined1 (*) [16])(local_630.ray + 0x140) = auVar87;
                  }
                  auVar203 = ZEXT3264(auVar112);
                  auVar181 = ZEXT3264(auVar179);
                  auVar87 = auVar223._0_16_;
                  bVar72 = ~(byte)(1 << ((uint)uVar73 & 0x1f)) & bVar82;
                  uVar144 = *(undefined4 *)(ray + k * 4 + 0x80);
                  auVar34._4_4_ = uVar144;
                  auVar34._0_4_ = uVar144;
                  auVar34._8_4_ = uVar144;
                  auVar34._12_4_ = uVar144;
                  auVar34._16_4_ = uVar144;
                  auVar34._20_4_ = uVar144;
                  auVar34._24_4_ = uVar144;
                  auVar34._28_4_ = uVar144;
                  uVar158 = vcmpps_avx512vl(auVar179,auVar34,2);
                  bVar82 = bVar72 & (byte)uVar158;
                  if ((bVar72 & (byte)uVar158) != 0) {
                    auVar157._8_4_ = 0x7f800000;
                    auVar157._0_8_ = 0x7f8000007f800000;
                    auVar157._12_4_ = 0x7f800000;
                    auVar157._16_4_ = 0x7f800000;
                    auVar157._20_4_ = 0x7f800000;
                    auVar157._24_4_ = 0x7f800000;
                    auVar157._28_4_ = 0x7f800000;
                    auVar121 = vblendmps_avx512vl(auVar157,auVar179);
                    auVar134._0_4_ =
                         (uint)(bVar82 & 1) * auVar121._0_4_ |
                         (uint)!(bool)(bVar82 & 1) * 0x7f800000;
                    bVar13 = (bool)(bVar82 >> 1 & 1);
                    auVar134._4_4_ = (uint)bVar13 * auVar121._4_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar82 >> 2 & 1);
                    auVar134._8_4_ = (uint)bVar13 * auVar121._8_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar82 >> 3 & 1);
                    auVar134._12_4_ = (uint)bVar13 * auVar121._12_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar82 >> 4 & 1);
                    auVar134._16_4_ = (uint)bVar13 * auVar121._16_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar82 >> 5 & 1);
                    auVar134._20_4_ = (uint)bVar13 * auVar121._20_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar82 >> 6 & 1);
                    auVar134._24_4_ = (uint)bVar13 * auVar121._24_4_ | (uint)!bVar13 * 0x7f800000;
                    auVar134._28_4_ =
                         (uint)(bVar82 >> 7) * auVar121._28_4_ |
                         (uint)!(bool)(bVar82 >> 7) * 0x7f800000;
                    auVar121 = vshufps_avx(auVar134,auVar134,0xb1);
                    auVar121 = vminps_avx(auVar134,auVar121);
                    auVar113 = vshufpd_avx(auVar121,auVar121,5);
                    auVar121 = vminps_avx(auVar121,auVar113);
                    auVar113 = vpermpd_avx2(auVar121,0x4e);
                    auVar121 = vminps_avx(auVar121,auVar113);
                    uVar158 = vcmpps_avx512vl(auVar134,auVar121,0);
                    bVar71 = (byte)uVar158 & bVar82;
                    bVar72 = bVar82;
                    if (bVar71 != 0) {
                      bVar72 = bVar71;
                    }
                    uVar75 = 0;
                    for (uVar74 = (uint)bVar72; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x80000000
                        ) {
                      uVar75 = uVar75 + 1;
                    }
                    uVar73 = (ulong)uVar75;
                  }
                } while (bVar82 != 0);
              }
            }
          }
        }
      }
      if (8 < iVar10) {
        local_460 = vpbroadcastd_avx512vl();
        local_4a0 = vbroadcastss_avx512vl(auVar87);
        fStack_3f0 = 1.0 / local_400;
        auStack_3fc._0_4_ = fStack_3f0;
        local_400 = fStack_3f0;
        auStack_3fc._4_4_ = fStack_3f0;
        fStack_3f4 = fStack_3f0;
        local_4c0 = vpbroadcastd_avx512vl();
        local_4d0 = vpbroadcastd_avx512vl();
        lVar80 = 8;
        auVar179 = auVar203._0_32_;
        auVar121 = auVar181._0_32_;
        local_420 = uVar77;
        uStack_41c = uVar77;
        uStack_418 = uVar77;
        uStack_414 = uVar77;
        uStack_410 = uVar77;
        uStack_40c = uVar77;
        uStack_408 = uVar77;
        uStack_404 = uVar77;
        fStack_3ec = fStack_3f0;
        fStack_3e8 = fStack_3f0;
        fStack_3e4 = fStack_3f0;
        do {
          auVar112 = vpbroadcastd_avx512vl();
          auVar96 = vpor_avx2(auVar112,_DAT_0205a920);
          uVar23 = vpcmpd_avx512vl(auVar96,local_460,1);
          auVar112 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar80 * 4 + lVar24);
          auVar113 = *(undefined1 (*) [32])(lVar24 + 0x22307f0 + lVar80 * 4);
          auVar111 = *(undefined1 (*) [32])(lVar24 + 0x2230c74 + lVar80 * 4);
          auVar110 = *(undefined1 (*) [32])(lVar24 + 0x22310f8 + lVar80 * 4);
          local_560 = auVar221._0_32_;
          auVar97 = vmulps_avx512vl(local_560,auVar110);
          local_580 = auVar222._0_32_;
          auVar98 = vmulps_avx512vl(local_580,auVar110);
          auVar39._4_4_ = auVar110._4_4_ * (float)local_120._4_4_;
          auVar39._0_4_ = auVar110._0_4_ * (float)local_120._0_4_;
          auVar39._8_4_ = auVar110._8_4_ * fStack_118;
          auVar39._12_4_ = auVar110._12_4_ * fStack_114;
          auVar39._16_4_ = auVar110._16_4_ * fStack_110;
          auVar39._20_4_ = auVar110._20_4_ * fStack_10c;
          auVar39._24_4_ = auVar110._24_4_ * fStack_108;
          auVar39._28_4_ = auVar96._28_4_;
          auVar96 = vfmadd231ps_avx512vl(auVar97,auVar111,local_c0);
          auVar97 = vfmadd231ps_avx512vl(auVar98,auVar111,local_e0);
          auVar98 = vfmadd231ps_avx512vl(auVar39,auVar111,local_100);
          auVar108 = auVar217._0_32_;
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar113,auVar108);
          auVar97 = vfmadd231ps_avx512vl(auVar97,auVar113,local_1c0);
          auVar87 = vfmadd231ps_fma(auVar98,auVar113,local_a0);
          auVar115 = auVar219._0_32_;
          auVar101 = vfmadd231ps_avx512vl(auVar96,auVar112,auVar115);
          auVar114 = auVar218._0_32_;
          auVar102 = vfmadd231ps_avx512vl(auVar97,auVar112,auVar114);
          auVar96 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar80 * 4 + lVar24);
          auVar97 = *(undefined1 (*) [32])(lVar24 + 0x2232c10 + lVar80 * 4);
          auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar112,local_80);
          auVar98 = *(undefined1 (*) [32])(lVar24 + 0x2233094 + lVar80 * 4);
          auVar109 = *(undefined1 (*) [32])(lVar24 + 0x2233518 + lVar80 * 4);
          auVar99 = vmulps_avx512vl(local_560,auVar109);
          auVar100 = vmulps_avx512vl(local_580,auVar109);
          auVar40._4_4_ = auVar109._4_4_ * (float)local_120._4_4_;
          auVar40._0_4_ = auVar109._0_4_ * (float)local_120._0_4_;
          auVar40._8_4_ = auVar109._8_4_ * fStack_118;
          auVar40._12_4_ = auVar109._12_4_ * fStack_114;
          auVar40._16_4_ = auVar109._16_4_ * fStack_110;
          auVar40._20_4_ = auVar109._20_4_ * fStack_10c;
          auVar40._24_4_ = auVar109._24_4_ * fStack_108;
          auVar40._28_4_ = uStack_104;
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar98,local_c0);
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar98,local_e0);
          auVar103 = vfmadd231ps_avx512vl(auVar40,auVar98,local_100);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar97,auVar108);
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar97,local_1c0);
          auVar91 = vfmadd231ps_fma(auVar103,auVar97,local_a0);
          auVar103 = vfmadd231ps_avx512vl(auVar99,auVar96,auVar115);
          auVar104 = vfmadd231ps_avx512vl(auVar100,auVar96,auVar114);
          auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar96,local_80);
          auVar105 = vmaxps_avx512vl(ZEXT1632(auVar87),ZEXT1632(auVar91));
          auVar99 = vsubps_avx(auVar103,auVar101);
          auVar100 = vsubps_avx(auVar104,auVar102);
          auVar106 = vmulps_avx512vl(auVar102,auVar99);
          auVar107 = vmulps_avx512vl(auVar101,auVar100);
          auVar106 = vsubps_avx512vl(auVar106,auVar107);
          auVar107 = vmulps_avx512vl(auVar100,auVar100);
          auVar107 = vfmadd231ps_avx512vl(auVar107,auVar99,auVar99);
          auVar105 = vmulps_avx512vl(auVar105,auVar105);
          auVar105 = vmulps_avx512vl(auVar105,auVar107);
          auVar106 = vmulps_avx512vl(auVar106,auVar106);
          uVar158 = vcmpps_avx512vl(auVar106,auVar105,2);
          local_330 = (byte)uVar23 & (byte)uVar158;
          if (local_330 == 0) {
            auVar218 = ZEXT3264(auVar114);
            auVar217 = ZEXT3264(auVar108);
          }
          else {
            auVar109 = vmulps_avx512vl(local_1a0,auVar109);
            auVar98 = vfmadd213ps_avx512vl(auVar98,local_180,auVar109);
            auVar97 = vfmadd213ps_avx512vl(auVar97,local_160,auVar98);
            auVar96 = vfmadd213ps_avx512vl(auVar96,local_140,auVar97);
            auVar110 = vmulps_avx512vl(local_1a0,auVar110);
            auVar111 = vfmadd213ps_avx512vl(auVar111,local_180,auVar110);
            auVar113 = vfmadd213ps_avx512vl(auVar113,local_160,auVar111);
            auVar97 = vfmadd213ps_avx512vl(auVar112,local_140,auVar113);
            auVar112 = *(undefined1 (*) [32])(lVar24 + 0x223157c + lVar80 * 4);
            auVar113 = *(undefined1 (*) [32])(lVar24 + 0x2231a00 + lVar80 * 4);
            auVar111 = *(undefined1 (*) [32])(lVar24 + 0x2231e84 + lVar80 * 4);
            auVar110 = *(undefined1 (*) [32])(lVar24 + 0x2232308 + lVar80 * 4);
            auVar98 = vmulps_avx512vl(local_560,auVar110);
            auVar109 = vmulps_avx512vl(local_580,auVar110);
            auVar110 = vmulps_avx512vl(local_1a0,auVar110);
            auVar98 = vfmadd231ps_avx512vl(auVar98,auVar111,local_c0);
            auVar109 = vfmadd231ps_avx512vl(auVar109,auVar111,local_e0);
            auVar111 = vfmadd231ps_avx512vl(auVar110,local_180,auVar111);
            auVar110 = vfmadd231ps_avx512vl(auVar98,auVar113,auVar108);
            auVar98 = vfmadd231ps_avx512vl(auVar109,auVar113,local_1c0);
            auVar113 = vfmadd231ps_avx512vl(auVar111,local_160,auVar113);
            auVar110 = vfmadd231ps_avx512vl(auVar110,auVar112,auVar115);
            auVar98 = vfmadd231ps_avx512vl(auVar98,auVar112,auVar114);
            auVar109 = vfmadd231ps_avx512vl(auVar113,local_140,auVar112);
            auVar112 = *(undefined1 (*) [32])(lVar24 + 0x223399c + lVar80 * 4);
            auVar113 = *(undefined1 (*) [32])(lVar24 + 0x22342a4 + lVar80 * 4);
            auVar111 = *(undefined1 (*) [32])(lVar24 + 0x2234728 + lVar80 * 4);
            auVar105 = vmulps_avx512vl(local_560,auVar111);
            auVar106 = vmulps_avx512vl(local_580,auVar111);
            auVar111 = vmulps_avx512vl(local_1a0,auVar111);
            auVar105 = vfmadd231ps_avx512vl(auVar105,auVar113,local_c0);
            auVar106 = vfmadd231ps_avx512vl(auVar106,auVar113,local_e0);
            auVar111 = vfmadd231ps_avx512vl(auVar111,local_180,auVar113);
            auVar113 = *(undefined1 (*) [32])(lVar24 + 0x2233e20 + lVar80 * 4);
            auVar105 = vfmadd231ps_avx512vl(auVar105,auVar113,auVar108);
            auVar148 = vfmadd231ps_fma(auVar106,auVar113,local_1c0);
            auVar113 = vfmadd231ps_avx512vl(auVar111,local_160,auVar113);
            auVar111 = vfmadd231ps_avx512vl(auVar105,auVar112,auVar115);
            auVar105 = vfmadd231ps_avx512vl(ZEXT1632(auVar148),auVar112,auVar114);
            auVar113 = vfmadd231ps_avx512vl(auVar113,local_140,auVar112);
            auVar106 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar110,auVar106);
            vandps_avx512vl(auVar98,auVar106);
            auVar112 = vmaxps_avx(auVar106,auVar106);
            vandps_avx512vl(auVar109,auVar106);
            auVar112 = vmaxps_avx(auVar112,auVar106);
            uVar73 = vcmpps_avx512vl(auVar112,local_4a0,1);
            bVar13 = (bool)((byte)uVar73 & 1);
            auVar123._0_4_ = (float)((uint)bVar13 * auVar99._0_4_ | (uint)!bVar13 * auVar110._0_4_);
            bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar123._4_4_ = (float)((uint)bVar13 * auVar99._4_4_ | (uint)!bVar13 * auVar110._4_4_);
            bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar123._8_4_ = (float)((uint)bVar13 * auVar99._8_4_ | (uint)!bVar13 * auVar110._8_4_);
            bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar123._12_4_ =
                 (float)((uint)bVar13 * auVar99._12_4_ | (uint)!bVar13 * auVar110._12_4_);
            bVar13 = (bool)((byte)(uVar73 >> 4) & 1);
            auVar123._16_4_ =
                 (float)((uint)bVar13 * auVar99._16_4_ | (uint)!bVar13 * auVar110._16_4_);
            bVar13 = (bool)((byte)(uVar73 >> 5) & 1);
            auVar123._20_4_ =
                 (float)((uint)bVar13 * auVar99._20_4_ | (uint)!bVar13 * auVar110._20_4_);
            bVar13 = (bool)((byte)(uVar73 >> 6) & 1);
            auVar123._24_4_ =
                 (float)((uint)bVar13 * auVar99._24_4_ | (uint)!bVar13 * auVar110._24_4_);
            bVar13 = SUB81(uVar73 >> 7,0);
            auVar123._28_4_ = (uint)bVar13 * auVar99._28_4_ | (uint)!bVar13 * auVar110._28_4_;
            bVar13 = (bool)((byte)uVar73 & 1);
            auVar124._0_4_ = (float)((uint)bVar13 * auVar100._0_4_ | (uint)!bVar13 * auVar98._0_4_);
            bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar124._4_4_ = (float)((uint)bVar13 * auVar100._4_4_ | (uint)!bVar13 * auVar98._4_4_);
            bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar124._8_4_ = (float)((uint)bVar13 * auVar100._8_4_ | (uint)!bVar13 * auVar98._8_4_);
            bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar124._12_4_ =
                 (float)((uint)bVar13 * auVar100._12_4_ | (uint)!bVar13 * auVar98._12_4_);
            bVar13 = (bool)((byte)(uVar73 >> 4) & 1);
            auVar124._16_4_ =
                 (float)((uint)bVar13 * auVar100._16_4_ | (uint)!bVar13 * auVar98._16_4_);
            bVar13 = (bool)((byte)(uVar73 >> 5) & 1);
            auVar124._20_4_ =
                 (float)((uint)bVar13 * auVar100._20_4_ | (uint)!bVar13 * auVar98._20_4_);
            bVar13 = (bool)((byte)(uVar73 >> 6) & 1);
            auVar124._24_4_ =
                 (float)((uint)bVar13 * auVar100._24_4_ | (uint)!bVar13 * auVar98._24_4_);
            bVar13 = SUB81(uVar73 >> 7,0);
            auVar124._28_4_ = (uint)bVar13 * auVar100._28_4_ | (uint)!bVar13 * auVar98._28_4_;
            vandps_avx512vl(auVar111,auVar106);
            vandps_avx512vl(auVar105,auVar106);
            auVar112 = vmaxps_avx(auVar124,auVar124);
            vandps_avx512vl(auVar113,auVar106);
            auVar112 = vmaxps_avx(auVar112,auVar124);
            uVar73 = vcmpps_avx512vl(auVar112,local_4a0,1);
            bVar13 = (bool)((byte)uVar73 & 1);
            auVar125._0_4_ = (uint)bVar13 * auVar99._0_4_ | (uint)!bVar13 * auVar111._0_4_;
            bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar125._4_4_ = (uint)bVar13 * auVar99._4_4_ | (uint)!bVar13 * auVar111._4_4_;
            bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar125._8_4_ = (uint)bVar13 * auVar99._8_4_ | (uint)!bVar13 * auVar111._8_4_;
            bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar125._12_4_ = (uint)bVar13 * auVar99._12_4_ | (uint)!bVar13 * auVar111._12_4_;
            bVar13 = (bool)((byte)(uVar73 >> 4) & 1);
            auVar125._16_4_ = (uint)bVar13 * auVar99._16_4_ | (uint)!bVar13 * auVar111._16_4_;
            bVar13 = (bool)((byte)(uVar73 >> 5) & 1);
            auVar125._20_4_ = (uint)bVar13 * auVar99._20_4_ | (uint)!bVar13 * auVar111._20_4_;
            bVar13 = (bool)((byte)(uVar73 >> 6) & 1);
            auVar125._24_4_ = (uint)bVar13 * auVar99._24_4_ | (uint)!bVar13 * auVar111._24_4_;
            bVar13 = SUB81(uVar73 >> 7,0);
            auVar125._28_4_ = (uint)bVar13 * auVar99._28_4_ | (uint)!bVar13 * auVar111._28_4_;
            bVar13 = (bool)((byte)uVar73 & 1);
            auVar126._0_4_ = (float)((uint)bVar13 * auVar100._0_4_ | (uint)!bVar13 * auVar105._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar126._4_4_ = (float)((uint)bVar13 * auVar100._4_4_ | (uint)!bVar13 * auVar105._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar126._8_4_ = (float)((uint)bVar13 * auVar100._8_4_ | (uint)!bVar13 * auVar105._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar126._12_4_ =
                 (float)((uint)bVar13 * auVar100._12_4_ | (uint)!bVar13 * auVar105._12_4_);
            bVar13 = (bool)((byte)(uVar73 >> 4) & 1);
            auVar126._16_4_ =
                 (float)((uint)bVar13 * auVar100._16_4_ | (uint)!bVar13 * auVar105._16_4_);
            bVar13 = (bool)((byte)(uVar73 >> 5) & 1);
            auVar126._20_4_ =
                 (float)((uint)bVar13 * auVar100._20_4_ | (uint)!bVar13 * auVar105._20_4_);
            bVar13 = (bool)((byte)(uVar73 >> 6) & 1);
            auVar126._24_4_ =
                 (float)((uint)bVar13 * auVar100._24_4_ | (uint)!bVar13 * auVar105._24_4_);
            bVar13 = SUB81(uVar73 >> 7,0);
            auVar126._28_4_ = (uint)bVar13 * auVar100._28_4_ | (uint)!bVar13 * auVar105._28_4_;
            auVar209._8_4_ = 0x80000000;
            auVar209._0_8_ = 0x8000000080000000;
            auVar209._12_4_ = 0x80000000;
            auVar209._16_4_ = 0x80000000;
            auVar209._20_4_ = 0x80000000;
            auVar209._24_4_ = 0x80000000;
            auVar209._28_4_ = 0x80000000;
            auVar112 = vxorps_avx512vl(auVar125,auVar209);
            auVar105 = auVar220._0_32_;
            auVar113 = vfmadd213ps_avx512vl(auVar123,auVar123,auVar105);
            auVar148 = vfmadd231ps_fma(auVar113,auVar124,auVar124);
            auVar113 = vrsqrt14ps_avx512vl(ZEXT1632(auVar148));
            auVar216._8_4_ = 0xbf000000;
            auVar216._0_8_ = 0xbf000000bf000000;
            auVar216._12_4_ = 0xbf000000;
            auVar216._16_4_ = 0xbf000000;
            auVar216._20_4_ = 0xbf000000;
            auVar216._24_4_ = 0xbf000000;
            auVar216._28_4_ = 0xbf000000;
            fVar183 = auVar113._0_4_;
            fVar190 = auVar113._4_4_;
            fVar191 = auVar113._8_4_;
            fVar192 = auVar113._12_4_;
            fVar166 = auVar113._16_4_;
            fVar182 = auVar113._20_4_;
            fVar83 = auVar113._24_4_;
            auVar41._4_4_ = fVar190 * fVar190 * fVar190 * auVar148._4_4_ * -0.5;
            auVar41._0_4_ = fVar183 * fVar183 * fVar183 * auVar148._0_4_ * -0.5;
            auVar41._8_4_ = fVar191 * fVar191 * fVar191 * auVar148._8_4_ * -0.5;
            auVar41._12_4_ = fVar192 * fVar192 * fVar192 * auVar148._12_4_ * -0.5;
            auVar41._16_4_ = fVar166 * fVar166 * fVar166 * -0.0;
            auVar41._20_4_ = fVar182 * fVar182 * fVar182 * -0.0;
            auVar41._24_4_ = fVar83 * fVar83 * fVar83 * -0.0;
            auVar41._28_4_ = auVar124._28_4_;
            auVar111 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar113 = vfmadd231ps_avx512vl(auVar41,auVar111,auVar113);
            auVar42._4_4_ = auVar124._4_4_ * auVar113._4_4_;
            auVar42._0_4_ = auVar124._0_4_ * auVar113._0_4_;
            auVar42._8_4_ = auVar124._8_4_ * auVar113._8_4_;
            auVar42._12_4_ = auVar124._12_4_ * auVar113._12_4_;
            auVar42._16_4_ = auVar124._16_4_ * auVar113._16_4_;
            auVar42._20_4_ = auVar124._20_4_ * auVar113._20_4_;
            auVar42._24_4_ = auVar124._24_4_ * auVar113._24_4_;
            auVar42._28_4_ = 0;
            auVar43._4_4_ = auVar113._4_4_ * -auVar123._4_4_;
            auVar43._0_4_ = auVar113._0_4_ * -auVar123._0_4_;
            auVar43._8_4_ = auVar113._8_4_ * -auVar123._8_4_;
            auVar43._12_4_ = auVar113._12_4_ * -auVar123._12_4_;
            auVar43._16_4_ = auVar113._16_4_ * -auVar123._16_4_;
            auVar43._20_4_ = auVar113._20_4_ * -auVar123._20_4_;
            auVar43._24_4_ = auVar113._24_4_ * -auVar123._24_4_;
            auVar43._28_4_ = auVar124._28_4_;
            auVar110 = vmulps_avx512vl(auVar113,auVar105);
            auVar113 = vfmadd213ps_avx512vl(auVar125,auVar125,auVar105);
            auVar113 = vfmadd231ps_avx512vl(auVar113,auVar126,auVar126);
            auVar98 = vrsqrt14ps_avx512vl(auVar113);
            auVar113 = vmulps_avx512vl(auVar113,auVar216);
            fVar183 = auVar98._0_4_;
            fVar190 = auVar98._4_4_;
            fVar191 = auVar98._8_4_;
            fVar192 = auVar98._12_4_;
            fVar166 = auVar98._16_4_;
            fVar182 = auVar98._20_4_;
            fVar83 = auVar98._24_4_;
            auVar44._4_4_ = fVar190 * fVar190 * fVar190 * auVar113._4_4_;
            auVar44._0_4_ = fVar183 * fVar183 * fVar183 * auVar113._0_4_;
            auVar44._8_4_ = fVar191 * fVar191 * fVar191 * auVar113._8_4_;
            auVar44._12_4_ = fVar192 * fVar192 * fVar192 * auVar113._12_4_;
            auVar44._16_4_ = fVar166 * fVar166 * fVar166 * auVar113._16_4_;
            auVar44._20_4_ = fVar182 * fVar182 * fVar182 * auVar113._20_4_;
            auVar44._24_4_ = fVar83 * fVar83 * fVar83 * auVar113._24_4_;
            auVar44._28_4_ = auVar113._28_4_;
            auVar113 = vfmadd231ps_avx512vl(auVar44,auVar111,auVar98);
            auVar45._4_4_ = auVar126._4_4_ * auVar113._4_4_;
            auVar45._0_4_ = auVar126._0_4_ * auVar113._0_4_;
            auVar45._8_4_ = auVar126._8_4_ * auVar113._8_4_;
            auVar45._12_4_ = auVar126._12_4_ * auVar113._12_4_;
            auVar45._16_4_ = auVar126._16_4_ * auVar113._16_4_;
            auVar45._20_4_ = auVar126._20_4_ * auVar113._20_4_;
            auVar45._24_4_ = auVar126._24_4_ * auVar113._24_4_;
            auVar45._28_4_ = auVar98._28_4_;
            auVar46._4_4_ = auVar113._4_4_ * auVar112._4_4_;
            auVar46._0_4_ = auVar113._0_4_ * auVar112._0_4_;
            auVar46._8_4_ = auVar113._8_4_ * auVar112._8_4_;
            auVar46._12_4_ = auVar113._12_4_ * auVar112._12_4_;
            auVar46._16_4_ = auVar113._16_4_ * auVar112._16_4_;
            auVar46._20_4_ = auVar113._20_4_ * auVar112._20_4_;
            auVar46._24_4_ = auVar113._24_4_ * auVar112._24_4_;
            auVar46._28_4_ = auVar112._28_4_;
            auVar112 = vmulps_avx512vl(auVar113,auVar105);
            auVar148 = vfmadd213ps_fma(auVar42,ZEXT1632(auVar87),auVar101);
            auVar113 = ZEXT1632(auVar87);
            auVar147 = vfmadd213ps_fma(auVar43,auVar113,auVar102);
            auVar111 = vfmadd213ps_avx512vl(auVar110,auVar113,auVar97);
            auVar98 = vfmadd213ps_avx512vl(auVar45,ZEXT1632(auVar91),auVar103);
            auVar92 = vfnmadd213ps_fma(auVar42,auVar113,auVar101);
            auVar109 = ZEXT1632(auVar91);
            auVar90 = vfmadd213ps_fma(auVar46,auVar109,auVar104);
            auVar88 = vfnmadd213ps_fma(auVar43,auVar113,auVar102);
            auVar20 = vfmadd213ps_fma(auVar112,auVar109,auVar96);
            auVar102 = ZEXT1632(auVar87);
            auVar145 = vfnmadd231ps_fma(auVar97,auVar102,auVar110);
            auVar86 = vfnmadd213ps_fma(auVar45,auVar109,auVar103);
            auVar85 = vfnmadd213ps_fma(auVar46,auVar109,auVar104);
            auVar93 = vfnmadd231ps_fma(auVar96,ZEXT1632(auVar91),auVar112);
            auVar96 = vsubps_avx512vl(auVar98,ZEXT1632(auVar92));
            auVar112 = vsubps_avx(ZEXT1632(auVar90),ZEXT1632(auVar88));
            auVar113 = vsubps_avx(ZEXT1632(auVar20),ZEXT1632(auVar145));
            auVar47._4_4_ = auVar112._4_4_ * auVar145._4_4_;
            auVar47._0_4_ = auVar112._0_4_ * auVar145._0_4_;
            auVar47._8_4_ = auVar112._8_4_ * auVar145._8_4_;
            auVar47._12_4_ = auVar112._12_4_ * auVar145._12_4_;
            auVar47._16_4_ = auVar112._16_4_ * 0.0;
            auVar47._20_4_ = auVar112._20_4_ * 0.0;
            auVar47._24_4_ = auVar112._24_4_ * 0.0;
            auVar47._28_4_ = auVar110._28_4_;
            auVar87 = vfmsub231ps_fma(auVar47,ZEXT1632(auVar88),auVar113);
            auVar48._4_4_ = auVar113._4_4_ * auVar92._4_4_;
            auVar48._0_4_ = auVar113._0_4_ * auVar92._0_4_;
            auVar48._8_4_ = auVar113._8_4_ * auVar92._8_4_;
            auVar48._12_4_ = auVar113._12_4_ * auVar92._12_4_;
            auVar48._16_4_ = auVar113._16_4_ * 0.0;
            auVar48._20_4_ = auVar113._20_4_ * 0.0;
            auVar48._24_4_ = auVar113._24_4_ * 0.0;
            auVar48._28_4_ = auVar113._28_4_;
            auVar21 = vfmsub231ps_fma(auVar48,ZEXT1632(auVar145),auVar96);
            auVar49._4_4_ = auVar88._4_4_ * auVar96._4_4_;
            auVar49._0_4_ = auVar88._0_4_ * auVar96._0_4_;
            auVar49._8_4_ = auVar88._8_4_ * auVar96._8_4_;
            auVar49._12_4_ = auVar88._12_4_ * auVar96._12_4_;
            auVar49._16_4_ = auVar96._16_4_ * 0.0;
            auVar49._20_4_ = auVar96._20_4_ * 0.0;
            auVar49._24_4_ = auVar96._24_4_ * 0.0;
            auVar49._28_4_ = auVar96._28_4_;
            auVar22 = vfmsub231ps_fma(auVar49,ZEXT1632(auVar92),auVar112);
            auVar112 = vfmadd231ps_avx512vl(ZEXT1632(auVar22),auVar105,ZEXT1632(auVar21));
            auVar112 = vfmadd231ps_avx512vl(auVar112,auVar105,ZEXT1632(auVar87));
            uVar73 = vcmpps_avx512vl(auVar112,auVar105,2);
            bVar82 = (byte)uVar73;
            fVar136 = (float)((uint)(bVar82 & 1) * auVar148._0_4_ |
                             (uint)!(bool)(bVar82 & 1) * auVar86._0_4_);
            bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
            fVar138 = (float)((uint)bVar13 * auVar148._4_4_ | (uint)!bVar13 * auVar86._4_4_);
            bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
            fVar141 = (float)((uint)bVar13 * auVar148._8_4_ | (uint)!bVar13 * auVar86._8_4_);
            bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
            fVar142 = (float)((uint)bVar13 * auVar148._12_4_ | (uint)!bVar13 * auVar86._12_4_);
            auVar109 = ZEXT1632(CONCAT412(fVar142,CONCAT48(fVar141,CONCAT44(fVar138,fVar136))));
            fVar137 = (float)((uint)(bVar82 & 1) * auVar147._0_4_ |
                             (uint)!(bool)(bVar82 & 1) * auVar85._0_4_);
            bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
            fVar140 = (float)((uint)bVar13 * auVar147._4_4_ | (uint)!bVar13 * auVar85._4_4_);
            bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
            fVar139 = (float)((uint)bVar13 * auVar147._8_4_ | (uint)!bVar13 * auVar85._8_4_);
            bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
            fVar143 = (float)((uint)bVar13 * auVar147._12_4_ | (uint)!bVar13 * auVar85._12_4_);
            auVar99 = ZEXT1632(CONCAT412(fVar143,CONCAT48(fVar139,CONCAT44(fVar140,fVar137))));
            auVar127._0_4_ =
                 (float)((uint)(bVar82 & 1) * auVar111._0_4_ |
                        (uint)!(bool)(bVar82 & 1) * auVar93._0_4_);
            bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar127._4_4_ = (float)((uint)bVar13 * auVar111._4_4_ | (uint)!bVar13 * auVar93._4_4_);
            bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar127._8_4_ = (float)((uint)bVar13 * auVar111._8_4_ | (uint)!bVar13 * auVar93._8_4_);
            bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar127._12_4_ =
                 (float)((uint)bVar13 * auVar111._12_4_ | (uint)!bVar13 * auVar93._12_4_);
            fVar191 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar111._16_4_);
            auVar127._16_4_ = fVar191;
            fVar190 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar111._20_4_);
            auVar127._20_4_ = fVar190;
            fVar183 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar111._24_4_);
            auVar127._24_4_ = fVar183;
            iVar1 = (uint)(byte)(uVar73 >> 7) * auVar111._28_4_;
            auVar127._28_4_ = iVar1;
            auVar112 = vblendmps_avx512vl(ZEXT1632(auVar92),auVar98);
            auVar128._0_4_ =
                 (uint)(bVar82 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar82 & 1) * auVar87._0_4_;
            bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar128._4_4_ = (uint)bVar13 * auVar112._4_4_ | (uint)!bVar13 * auVar87._4_4_;
            bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar128._8_4_ = (uint)bVar13 * auVar112._8_4_ | (uint)!bVar13 * auVar87._8_4_;
            bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar128._12_4_ = (uint)bVar13 * auVar112._12_4_ | (uint)!bVar13 * auVar87._12_4_;
            auVar128._16_4_ = (uint)((byte)(uVar73 >> 4) & 1) * auVar112._16_4_;
            auVar128._20_4_ = (uint)((byte)(uVar73 >> 5) & 1) * auVar112._20_4_;
            auVar128._24_4_ = (uint)((byte)(uVar73 >> 6) & 1) * auVar112._24_4_;
            auVar128._28_4_ = (uint)(byte)(uVar73 >> 7) * auVar112._28_4_;
            auVar112 = vblendmps_avx512vl(ZEXT1632(auVar88),ZEXT1632(auVar90));
            auVar129._0_4_ =
                 (float)((uint)(bVar82 & 1) * auVar112._0_4_ |
                        (uint)!(bool)(bVar82 & 1) * auVar148._0_4_);
            bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar129._4_4_ = (float)((uint)bVar13 * auVar112._4_4_ | (uint)!bVar13 * auVar148._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar129._8_4_ = (float)((uint)bVar13 * auVar112._8_4_ | (uint)!bVar13 * auVar148._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar129._12_4_ =
                 (float)((uint)bVar13 * auVar112._12_4_ | (uint)!bVar13 * auVar148._12_4_);
            fVar182 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar112._16_4_);
            auVar129._16_4_ = fVar182;
            fVar192 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar112._20_4_);
            auVar129._20_4_ = fVar192;
            fVar166 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar112._24_4_);
            auVar129._24_4_ = fVar166;
            auVar129._28_4_ = (uint)(byte)(uVar73 >> 7) * auVar112._28_4_;
            auVar112 = vblendmps_avx512vl(ZEXT1632(auVar145),ZEXT1632(auVar20));
            auVar130._0_4_ =
                 (float)((uint)(bVar82 & 1) * auVar112._0_4_ |
                        (uint)!(bool)(bVar82 & 1) * auVar147._0_4_);
            bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar130._4_4_ = (float)((uint)bVar13 * auVar112._4_4_ | (uint)!bVar13 * auVar147._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar130._8_4_ = (float)((uint)bVar13 * auVar112._8_4_ | (uint)!bVar13 * auVar147._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar130._12_4_ =
                 (float)((uint)bVar13 * auVar112._12_4_ | (uint)!bVar13 * auVar147._12_4_);
            fVar84 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar112._16_4_);
            auVar130._16_4_ = fVar84;
            fVar135 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar112._20_4_);
            auVar130._20_4_ = fVar135;
            fVar83 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar112._24_4_);
            auVar130._24_4_ = fVar83;
            iVar2 = (uint)(byte)(uVar73 >> 7) * auVar112._28_4_;
            auVar130._28_4_ = iVar2;
            auVar131._0_4_ =
                 (uint)(bVar82 & 1) * (int)auVar92._0_4_ | (uint)!(bool)(bVar82 & 1) * auVar98._0_4_
            ;
            bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar131._4_4_ = (uint)bVar13 * (int)auVar92._4_4_ | (uint)!bVar13 * auVar98._4_4_;
            bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar131._8_4_ = (uint)bVar13 * (int)auVar92._8_4_ | (uint)!bVar13 * auVar98._8_4_;
            bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar131._12_4_ = (uint)bVar13 * (int)auVar92._12_4_ | (uint)!bVar13 * auVar98._12_4_;
            auVar131._16_4_ = (uint)!(bool)((byte)(uVar73 >> 4) & 1) * auVar98._16_4_;
            auVar131._20_4_ = (uint)!(bool)((byte)(uVar73 >> 5) & 1) * auVar98._20_4_;
            auVar131._24_4_ = (uint)!(bool)((byte)(uVar73 >> 6) & 1) * auVar98._24_4_;
            auVar131._28_4_ = (uint)!SUB81(uVar73 >> 7,0) * auVar98._28_4_;
            bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar73 >> 2) & 1);
            bVar17 = (bool)((byte)(uVar73 >> 3) & 1);
            bVar14 = (bool)((byte)(uVar73 >> 1) & 1);
            bVar16 = (bool)((byte)(uVar73 >> 2) & 1);
            bVar18 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar98 = vsubps_avx512vl(auVar131,auVar109);
            auVar113 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar88._12_4_ |
                                                     (uint)!bVar17 * auVar90._12_4_,
                                                     CONCAT48((uint)bVar15 * (int)auVar88._8_4_ |
                                                              (uint)!bVar15 * auVar90._8_4_,
                                                              CONCAT44((uint)bVar13 *
                                                                       (int)auVar88._4_4_ |
                                                                       (uint)!bVar13 * auVar90._4_4_
                                                                       ,(uint)(bVar82 & 1) *
                                                                        (int)auVar88._0_4_ |
                                                                        (uint)!(bool)(bVar82 & 1) *
                                                                        auVar90._0_4_)))),auVar99);
            auVar111 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar145._12_4_ |
                                                     (uint)!bVar18 * auVar20._12_4_,
                                                     CONCAT48((uint)bVar16 * (int)auVar145._8_4_ |
                                                              (uint)!bVar16 * auVar20._8_4_,
                                                              CONCAT44((uint)bVar14 *
                                                                       (int)auVar145._4_4_ |
                                                                       (uint)!bVar14 * auVar20._4_4_
                                                                       ,(uint)(bVar82 & 1) *
                                                                        (int)auVar145._0_4_ |
                                                                        (uint)!(bool)(bVar82 & 1) *
                                                                        auVar20._0_4_)))),auVar127);
            auVar110 = vsubps_avx(auVar109,auVar128);
            auVar96 = vsubps_avx(auVar99,auVar129);
            auVar97 = vsubps_avx(auVar127,auVar130);
            auVar50._4_4_ = auVar111._4_4_ * fVar138;
            auVar50._0_4_ = auVar111._0_4_ * fVar136;
            auVar50._8_4_ = auVar111._8_4_ * fVar141;
            auVar50._12_4_ = auVar111._12_4_ * fVar142;
            auVar50._16_4_ = auVar111._16_4_ * 0.0;
            auVar50._20_4_ = auVar111._20_4_ * 0.0;
            auVar50._24_4_ = auVar111._24_4_ * 0.0;
            auVar50._28_4_ = 0;
            auVar87 = vfmsub231ps_fma(auVar50,auVar127,auVar98);
            auVar180._0_4_ = fVar137 * auVar98._0_4_;
            auVar180._4_4_ = fVar140 * auVar98._4_4_;
            auVar180._8_4_ = fVar139 * auVar98._8_4_;
            auVar180._12_4_ = fVar143 * auVar98._12_4_;
            auVar180._16_4_ = auVar98._16_4_ * 0.0;
            auVar180._20_4_ = auVar98._20_4_ * 0.0;
            auVar180._24_4_ = auVar98._24_4_ * 0.0;
            auVar180._28_4_ = 0;
            auVar148 = vfmsub231ps_fma(auVar180,auVar109,auVar113);
            auVar112 = vfmadd231ps_avx512vl(ZEXT1632(auVar148),auVar105,ZEXT1632(auVar87));
            auVar188._0_4_ = auVar113._0_4_ * auVar127._0_4_;
            auVar188._4_4_ = auVar113._4_4_ * auVar127._4_4_;
            auVar188._8_4_ = auVar113._8_4_ * auVar127._8_4_;
            auVar188._12_4_ = auVar113._12_4_ * auVar127._12_4_;
            auVar188._16_4_ = auVar113._16_4_ * fVar191;
            auVar188._20_4_ = auVar113._20_4_ * fVar190;
            auVar188._24_4_ = auVar113._24_4_ * fVar183;
            auVar188._28_4_ = 0;
            auVar87 = vfmsub231ps_fma(auVar188,auVar99,auVar111);
            auVar100 = vfmadd231ps_avx512vl(auVar112,auVar105,ZEXT1632(auVar87));
            auVar112 = vmulps_avx512vl(auVar97,auVar128);
            auVar112 = vfmsub231ps_avx512vl(auVar112,auVar110,auVar130);
            auVar51._4_4_ = auVar96._4_4_ * auVar130._4_4_;
            auVar51._0_4_ = auVar96._0_4_ * auVar130._0_4_;
            auVar51._8_4_ = auVar96._8_4_ * auVar130._8_4_;
            auVar51._12_4_ = auVar96._12_4_ * auVar130._12_4_;
            auVar51._16_4_ = auVar96._16_4_ * fVar84;
            auVar51._20_4_ = auVar96._20_4_ * fVar135;
            auVar51._24_4_ = auVar96._24_4_ * fVar83;
            auVar51._28_4_ = iVar2;
            auVar87 = vfmsub231ps_fma(auVar51,auVar129,auVar97);
            auVar189._0_4_ = auVar129._0_4_ * auVar110._0_4_;
            auVar189._4_4_ = auVar129._4_4_ * auVar110._4_4_;
            auVar189._8_4_ = auVar129._8_4_ * auVar110._8_4_;
            auVar189._12_4_ = auVar129._12_4_ * auVar110._12_4_;
            auVar189._16_4_ = fVar182 * auVar110._16_4_;
            auVar189._20_4_ = fVar192 * auVar110._20_4_;
            auVar189._24_4_ = fVar166 * auVar110._24_4_;
            auVar189._28_4_ = 0;
            auVar148 = vfmsub231ps_fma(auVar189,auVar96,auVar128);
            auVar112 = vfmadd231ps_avx512vl(ZEXT1632(auVar148),auVar105,auVar112);
            auVar101 = vfmadd231ps_avx512vl(auVar112,auVar105,ZEXT1632(auVar87));
            auVar112 = vmaxps_avx(auVar100,auVar101);
            uVar158 = vcmpps_avx512vl(auVar112,auVar105,2);
            local_330 = local_330 & (byte)uVar158;
            if (local_330 == 0) {
LAB_01b6347b:
              local_330 = 0;
            }
            else {
              auVar52._4_4_ = auVar97._4_4_ * auVar113._4_4_;
              auVar52._0_4_ = auVar97._0_4_ * auVar113._0_4_;
              auVar52._8_4_ = auVar97._8_4_ * auVar113._8_4_;
              auVar52._12_4_ = auVar97._12_4_ * auVar113._12_4_;
              auVar52._16_4_ = auVar97._16_4_ * auVar113._16_4_;
              auVar52._20_4_ = auVar97._20_4_ * auVar113._20_4_;
              auVar52._24_4_ = auVar97._24_4_ * auVar113._24_4_;
              auVar52._28_4_ = auVar112._28_4_;
              auVar147 = vfmsub231ps_fma(auVar52,auVar96,auVar111);
              auVar53._4_4_ = auVar111._4_4_ * auVar110._4_4_;
              auVar53._0_4_ = auVar111._0_4_ * auVar110._0_4_;
              auVar53._8_4_ = auVar111._8_4_ * auVar110._8_4_;
              auVar53._12_4_ = auVar111._12_4_ * auVar110._12_4_;
              auVar53._16_4_ = auVar111._16_4_ * auVar110._16_4_;
              auVar53._20_4_ = auVar111._20_4_ * auVar110._20_4_;
              auVar53._24_4_ = auVar111._24_4_ * auVar110._24_4_;
              auVar53._28_4_ = auVar111._28_4_;
              auVar148 = vfmsub231ps_fma(auVar53,auVar98,auVar97);
              auVar54._4_4_ = auVar96._4_4_ * auVar98._4_4_;
              auVar54._0_4_ = auVar96._0_4_ * auVar98._0_4_;
              auVar54._8_4_ = auVar96._8_4_ * auVar98._8_4_;
              auVar54._12_4_ = auVar96._12_4_ * auVar98._12_4_;
              auVar54._16_4_ = auVar96._16_4_ * auVar98._16_4_;
              auVar54._20_4_ = auVar96._20_4_ * auVar98._20_4_;
              auVar54._24_4_ = auVar96._24_4_ * auVar98._24_4_;
              auVar54._28_4_ = auVar96._28_4_;
              auVar90 = vfmsub231ps_fma(auVar54,auVar110,auVar113);
              auVar87 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar148),ZEXT1632(auVar90));
              auVar112 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),ZEXT1632(auVar147),auVar105);
              auVar113 = vrcp14ps_avx512vl(auVar112);
              auVar29._8_4_ = 0x3f800000;
              auVar29._0_8_ = &DAT_3f8000003f800000;
              auVar29._12_4_ = 0x3f800000;
              auVar29._16_4_ = 0x3f800000;
              auVar29._20_4_ = 0x3f800000;
              auVar29._24_4_ = 0x3f800000;
              auVar29._28_4_ = 0x3f800000;
              auVar111 = vfnmadd213ps_avx512vl(auVar113,auVar112,auVar29);
              auVar87 = vfmadd132ps_fma(auVar111,auVar113,auVar113);
              auVar55._4_4_ = auVar90._4_4_ * auVar127._4_4_;
              auVar55._0_4_ = auVar90._0_4_ * auVar127._0_4_;
              auVar55._8_4_ = auVar90._8_4_ * auVar127._8_4_;
              auVar55._12_4_ = auVar90._12_4_ * auVar127._12_4_;
              auVar55._16_4_ = fVar191 * 0.0;
              auVar55._20_4_ = fVar190 * 0.0;
              auVar55._24_4_ = fVar183 * 0.0;
              auVar55._28_4_ = iVar1;
              auVar148 = vfmadd231ps_fma(auVar55,auVar99,ZEXT1632(auVar148));
              auVar148 = vfmadd231ps_fma(ZEXT1632(auVar148),auVar109,ZEXT1632(auVar147));
              fVar183 = auVar87._0_4_;
              fVar190 = auVar87._4_4_;
              fVar191 = auVar87._8_4_;
              fVar192 = auVar87._12_4_;
              auVar113 = ZEXT1632(CONCAT412(auVar148._12_4_ * fVar192,
                                            CONCAT48(auVar148._8_4_ * fVar191,
                                                     CONCAT44(auVar148._4_4_ * fVar190,
                                                              auVar148._0_4_ * fVar183))));
              auVar70._4_4_ = uStack_41c;
              auVar70._0_4_ = local_420;
              auVar70._8_4_ = uStack_418;
              auVar70._12_4_ = uStack_414;
              auVar70._16_4_ = uStack_410;
              auVar70._20_4_ = uStack_40c;
              auVar70._24_4_ = uStack_408;
              auVar70._28_4_ = uStack_404;
              uVar158 = vcmpps_avx512vl(auVar113,auVar70,0xd);
              uVar144 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar30._4_4_ = uVar144;
              auVar30._0_4_ = uVar144;
              auVar30._8_4_ = uVar144;
              auVar30._12_4_ = uVar144;
              auVar30._16_4_ = uVar144;
              auVar30._20_4_ = uVar144;
              auVar30._24_4_ = uVar144;
              auVar30._28_4_ = uVar144;
              uVar23 = vcmpps_avx512vl(auVar113,auVar30,2);
              local_330 = (byte)uVar158 & (byte)uVar23 & local_330;
              if (local_330 == 0) goto LAB_01b6347b;
              uVar158 = vcmpps_avx512vl(auVar112,auVar105,4);
              if ((local_330 & (byte)uVar158) == 0) {
                local_330 = 0;
              }
              else {
                local_330 = local_330 & (byte)uVar158;
                fVar166 = auVar100._0_4_ * fVar183;
                fVar182 = auVar100._4_4_ * fVar190;
                auVar56._4_4_ = fVar182;
                auVar56._0_4_ = fVar166;
                fVar83 = auVar100._8_4_ * fVar191;
                auVar56._8_4_ = fVar83;
                fVar84 = auVar100._12_4_ * fVar192;
                auVar56._12_4_ = fVar84;
                fVar135 = auVar100._16_4_ * 0.0;
                auVar56._16_4_ = fVar135;
                fVar136 = auVar100._20_4_ * 0.0;
                auVar56._20_4_ = fVar136;
                fVar137 = auVar100._24_4_ * 0.0;
                auVar56._24_4_ = fVar137;
                auVar56._28_4_ = auVar100._28_4_;
                fVar183 = auVar101._0_4_ * fVar183;
                fVar190 = auVar101._4_4_ * fVar190;
                auVar57._4_4_ = fVar190;
                auVar57._0_4_ = fVar183;
                fVar191 = auVar101._8_4_ * fVar191;
                auVar57._8_4_ = fVar191;
                fVar192 = auVar101._12_4_ * fVar192;
                auVar57._12_4_ = fVar192;
                fVar138 = auVar101._16_4_ * 0.0;
                auVar57._16_4_ = fVar138;
                fVar140 = auVar101._20_4_ * 0.0;
                auVar57._20_4_ = fVar140;
                fVar141 = auVar101._24_4_ * 0.0;
                auVar57._24_4_ = fVar141;
                auVar57._28_4_ = auVar101._28_4_;
                auVar199._8_4_ = 0x3f800000;
                auVar199._0_8_ = &DAT_3f8000003f800000;
                auVar199._12_4_ = 0x3f800000;
                auVar199._16_4_ = 0x3f800000;
                auVar199._20_4_ = 0x3f800000;
                auVar199._24_4_ = 0x3f800000;
                auVar199._28_4_ = 0x3f800000;
                auVar112 = vsubps_avx512vl(auVar199,auVar56);
                bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
                bVar14 = (bool)((byte)(uVar73 >> 2) & 1);
                bVar15 = (bool)((byte)(uVar73 >> 3) & 1);
                bVar16 = (bool)((byte)(uVar73 >> 4) & 1);
                bVar17 = (bool)((byte)(uVar73 >> 5) & 1);
                bVar18 = (bool)((byte)(uVar73 >> 6) & 1);
                bVar19 = SUB81(uVar73 >> 7,0);
                in_ZMM20 = ZEXT3264(CONCAT428((uint)bVar19 * auVar100._28_4_ |
                                              (uint)!bVar19 * auVar112._28_4_,
                                              CONCAT424((uint)bVar18 * (int)fVar137 |
                                                        (uint)!bVar18 * auVar112._24_4_,
                                                        CONCAT420((uint)bVar17 * (int)fVar136 |
                                                                  (uint)!bVar17 * auVar112._20_4_,
                                                                  CONCAT416((uint)bVar16 *
                                                                            (int)fVar135 |
                                                                            (uint)!bVar16 *
                                                                            auVar112._16_4_,
                                                                            CONCAT412((uint)bVar15 *
                                                                                      (int)fVar84 |
                                                                                      (uint)!bVar15
                                                                                      * auVar112.
                                                  _12_4_,CONCAT48((uint)bVar14 * (int)fVar83 |
                                                                  (uint)!bVar14 * auVar112._8_4_,
                                                                  CONCAT44((uint)bVar13 *
                                                                           (int)fVar182 |
                                                                           (uint)!bVar13 *
                                                                           auVar112._4_4_,
                                                                           (uint)(bVar82 & 1) *
                                                                           (int)fVar166 |
                                                                           (uint)!(bool)(bVar82 & 1)
                                                                           * auVar112._0_4_))))))));
                auVar112 = vsubps_avx(auVar199,auVar57);
                bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
                bVar14 = (bool)((byte)(uVar73 >> 2) & 1);
                bVar15 = (bool)((byte)(uVar73 >> 3) & 1);
                bVar16 = (bool)((byte)(uVar73 >> 4) & 1);
                bVar17 = (bool)((byte)(uVar73 >> 5) & 1);
                bVar18 = (bool)((byte)(uVar73 >> 6) & 1);
                bVar19 = SUB81(uVar73 >> 7,0);
                local_220._4_4_ = (uint)bVar13 * (int)fVar190 | (uint)!bVar13 * auVar112._4_4_;
                local_220._0_4_ =
                     (uint)(bVar82 & 1) * (int)fVar183 | (uint)!(bool)(bVar82 & 1) * auVar112._0_4_;
                local_220._8_4_ = (uint)bVar14 * (int)fVar191 | (uint)!bVar14 * auVar112._8_4_;
                local_220._12_4_ = (uint)bVar15 * (int)fVar192 | (uint)!bVar15 * auVar112._12_4_;
                local_220._16_4_ = (uint)bVar16 * (int)fVar138 | (uint)!bVar16 * auVar112._16_4_;
                local_220._20_4_ = (uint)bVar17 * (int)fVar140 | (uint)!bVar17 * auVar112._20_4_;
                local_220._24_4_ = (uint)bVar18 * (int)fVar141 | (uint)!bVar18 * auVar112._24_4_;
                local_220._28_4_ = (uint)bVar19 * auVar101._28_4_ | (uint)!bVar19 * auVar112._28_4_;
                in_ZMM21 = ZEXT3264(auVar113);
              }
            }
            auVar218 = ZEXT3264(local_5c0);
            auVar217 = ZEXT3264(local_5e0);
            if (local_330 != 0) {
              auVar112 = vsubps_avx(ZEXT1632(auVar91),auVar102);
              local_520 = in_ZMM20._0_32_;
              auVar112 = vfmadd213ps_avx512vl(auVar112,local_520,auVar102);
              auVar153._0_4_ = auVar112._0_4_ + auVar112._0_4_;
              auVar153._4_4_ = auVar112._4_4_ + auVar112._4_4_;
              auVar153._8_4_ = auVar112._8_4_ + auVar112._8_4_;
              auVar153._12_4_ = auVar112._12_4_ + auVar112._12_4_;
              auVar153._16_4_ = auVar112._16_4_ + auVar112._16_4_;
              auVar153._20_4_ = auVar112._20_4_ + auVar112._20_4_;
              auVar153._24_4_ = auVar112._24_4_ + auVar112._24_4_;
              auVar153._28_4_ = auVar112._28_4_ + auVar112._28_4_;
              uVar144 = *(undefined4 *)((long)local_658->ray_space + k * 4 + -0x10);
              auVar31._4_4_ = uVar144;
              auVar31._0_4_ = uVar144;
              auVar31._8_4_ = uVar144;
              auVar31._12_4_ = uVar144;
              auVar31._16_4_ = uVar144;
              auVar31._20_4_ = uVar144;
              auVar31._24_4_ = uVar144;
              auVar31._28_4_ = uVar144;
              auVar112 = vmulps_avx512vl(auVar153,auVar31);
              local_540 = in_ZMM21._0_32_;
              uVar158 = vcmpps_avx512vl(local_540,auVar112,6);
              local_330 = local_330 & (byte)uVar158;
              uVar77 = (uint)local_330;
              if (local_330 != 0) {
                auVar154._8_4_ = 0xbf800000;
                auVar154._0_8_ = 0xbf800000bf800000;
                auVar154._12_4_ = 0xbf800000;
                auVar154._16_4_ = 0xbf800000;
                auVar154._20_4_ = 0xbf800000;
                auVar154._24_4_ = 0xbf800000;
                auVar154._28_4_ = 0xbf800000;
                auVar32._8_4_ = 0x40000000;
                auVar32._0_8_ = 0x4000000040000000;
                auVar32._12_4_ = 0x40000000;
                auVar32._16_4_ = 0x40000000;
                auVar32._20_4_ = 0x40000000;
                auVar32._24_4_ = 0x40000000;
                auVar32._28_4_ = 0x40000000;
                local_3c0 = vfmadd132ps_avx512vl(local_220,auVar154,auVar32);
                local_220 = local_3c0;
                auVar112 = local_220;
                local_380 = (undefined4)lVar80;
                local_360 = local_640;
                uStack_358 = uStack_638;
                local_350 = local_650;
                uStack_348 = uStack_648;
                local_340 = CONCAT44(fStack_5fc,local_600);
                uStack_338 = CONCAT44(fStack_5f4,fStack_5f8);
                pGVar78 = (context->scene->geometries).items[uVar79].ptr;
                local_220 = auVar112;
                if ((pGVar78->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  auVar112 = vaddps_avx512vl(local_520,_DAT_02020f40);
                  auVar87 = vcvtsi2ss_avx512f(local_c0._0_16_,local_380);
                  fVar183 = auVar87._0_4_;
                  local_320[0] = (fVar183 + auVar112._0_4_) * local_400;
                  local_320[1] = (fVar183 + auVar112._4_4_) * (float)auStack_3fc._0_4_;
                  local_320[2] = (fVar183 + auVar112._8_4_) * (float)auStack_3fc._4_4_;
                  local_320[3] = (fVar183 + auVar112._12_4_) * fStack_3f4;
                  fStack_310 = (fVar183 + auVar112._16_4_) * fStack_3f0;
                  fStack_30c = (fVar183 + auVar112._20_4_) * fStack_3ec;
                  fStack_308 = (fVar183 + auVar112._24_4_) * fStack_3e8;
                  fStack_304 = fVar183 + auVar112._28_4_;
                  local_220._0_8_ = local_3c0._0_8_;
                  local_220._8_8_ = local_3c0._8_8_;
                  local_220._16_8_ = local_3c0._16_8_;
                  local_220._24_8_ = local_3c0._24_8_;
                  local_300 = local_220._0_8_;
                  uStack_2f8 = local_220._8_8_;
                  uStack_2f0 = local_220._16_8_;
                  uStack_2e8 = local_220._24_8_;
                  local_2e0 = local_540;
                  auVar155._8_4_ = 0x7f800000;
                  auVar155._0_8_ = 0x7f8000007f800000;
                  auVar155._12_4_ = 0x7f800000;
                  auVar155._16_4_ = 0x7f800000;
                  auVar155._20_4_ = 0x7f800000;
                  auVar155._24_4_ = 0x7f800000;
                  auVar155._28_4_ = 0x7f800000;
                  auVar112 = vblendmps_avx512vl(auVar155,local_540);
                  auVar132._0_4_ =
                       (uint)(local_330 & 1) * auVar112._0_4_ |
                       (uint)!(bool)(local_330 & 1) * 0x7f800000;
                  bVar13 = (bool)(local_330 >> 1 & 1);
                  auVar132._4_4_ = (uint)bVar13 * auVar112._4_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_330 >> 2 & 1);
                  auVar132._8_4_ = (uint)bVar13 * auVar112._8_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_330 >> 3 & 1);
                  auVar132._12_4_ = (uint)bVar13 * auVar112._12_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_330 >> 4 & 1);
                  auVar132._16_4_ = (uint)bVar13 * auVar112._16_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_330 >> 5 & 1);
                  auVar132._20_4_ = (uint)bVar13 * auVar112._20_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_330 >> 6 & 1);
                  auVar132._24_4_ = (uint)bVar13 * auVar112._24_4_ | (uint)!bVar13 * 0x7f800000;
                  auVar132._28_4_ =
                       (uint)(local_330 >> 7) * auVar112._28_4_ |
                       (uint)!(bool)(local_330 >> 7) * 0x7f800000;
                  auVar112 = vshufps_avx(auVar132,auVar132,0xb1);
                  auVar112 = vminps_avx(auVar132,auVar112);
                  auVar113 = vshufpd_avx(auVar112,auVar112,5);
                  auVar112 = vminps_avx(auVar112,auVar113);
                  auVar113 = vpermpd_avx2(auVar112,0x4e);
                  auVar112 = vminps_avx(auVar112,auVar113);
                  uVar158 = vcmpps_avx512vl(auVar132,auVar112,0);
                  bVar72 = (byte)uVar158 & local_330;
                  bVar82 = local_330;
                  if (bVar72 != 0) {
                    bVar82 = bVar72;
                  }
                  uVar75 = 0;
                  for (uVar74 = (uint)bVar82; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x80000000)
                  {
                    uVar75 = uVar75 + 1;
                  }
                  uVar73 = (ulong)uVar75;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar78->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar183 = local_320[uVar73];
                    uVar144 = *(undefined4 *)((long)&local_300 + uVar73 * 4);
                    fVar190 = 1.0 - fVar183;
                    auVar147 = vfnmadd231ss_fma(ZEXT416((uint)(fVar183 * (fVar190 + fVar190))),
                                                ZEXT416((uint)fVar190),ZEXT416((uint)fVar190));
                    auVar148 = ZEXT416((uint)fVar183);
                    auVar87 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar148,
                                              ZEXT416(0xc0a00000));
                    auVar91 = vfmadd231ss_fma(ZEXT416((uint)(fVar183 * fVar183 * 3.0)),
                                              ZEXT416((uint)(fVar183 + fVar183)),auVar87);
                    auVar87 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar148,
                                              ZEXT416(0x40000000));
                    auVar87 = vfmadd231ss_fma(ZEXT416((uint)(fVar190 * fVar190 * -3.0)),
                                              ZEXT416((uint)(fVar190 + fVar190)),auVar87);
                    auVar148 = vfmadd231ss_fma(ZEXT416((uint)(fVar183 * fVar183)),auVar148,
                                               ZEXT416((uint)(fVar190 * -2.0)));
                    fVar190 = auVar147._0_4_ * 0.5;
                    fVar191 = auVar91._0_4_ * 0.5;
                    fVar192 = auVar87._0_4_ * 0.5;
                    fVar166 = auVar148._0_4_ * 0.5;
                    auVar173._0_4_ = fVar166 * local_600;
                    auVar173._4_4_ = fVar166 * fStack_5fc;
                    auVar173._8_4_ = fVar166 * fStack_5f8;
                    auVar173._12_4_ = fVar166 * fStack_5f4;
                    auVar195._4_4_ = fVar192;
                    auVar195._0_4_ = fVar192;
                    auVar195._8_4_ = fVar192;
                    auVar195._12_4_ = fVar192;
                    auVar63._8_8_ = uStack_648;
                    auVar63._0_8_ = local_650;
                    auVar87 = vfmadd132ps_fma(auVar195,auVar173,auVar63);
                    auVar174._4_4_ = fVar191;
                    auVar174._0_4_ = fVar191;
                    auVar174._8_4_ = fVar191;
                    auVar174._12_4_ = fVar191;
                    auVar64._8_8_ = uStack_638;
                    auVar64._0_8_ = local_640;
                    auVar87 = vfmadd132ps_fma(auVar174,auVar87,auVar64);
                    auVar165._4_4_ = fVar190;
                    auVar165._0_4_ = fVar190;
                    auVar165._8_4_ = fVar190;
                    auVar165._12_4_ = fVar190;
                    auVar87 = vfmadd213ps_fma(auVar165,auVar89,auVar87);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2e0 + uVar73 * 4);
                    *(int *)(ray + k * 4 + 0xc0) = auVar87._0_4_;
                    uVar11 = vextractps_avx(auVar87,1);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar11;
                    uVar11 = vextractps_avx(auVar87,2);
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar11;
                    *(float *)(ray + k * 4 + 0xf0) = fVar183;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar144;
                    *(uint *)(ray + k * 4 + 0x110) = uVar9;
                    *(uint *)(ray + k * 4 + 0x120) = uVar79;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    local_4f0 = local_640;
                    uStack_4e8 = uStack_638;
                    local_500 = (float)local_650;
                    fStack_4fc = (float)((ulong)local_650 >> 0x20);
                    fStack_4f8 = (float)uStack_648;
                    fStack_4f4 = (float)((ulong)uStack_648 >> 0x20);
                    local_1e0 = local_340;
                    uStack_1d8 = uStack_338;
                    local_5e8 = pGVar78;
                    local_3e0 = local_520;
                    local_3a0 = local_540;
                    local_37c = iVar10;
                    local_370 = auVar89;
                    do {
                      auVar90 = auVar220._0_16_;
                      local_4e0 = *(undefined4 *)(ray + k * 4 + 0x80);
                      fVar183 = local_320[uVar73];
                      local_280._4_4_ = fVar183;
                      local_280._0_4_ = fVar183;
                      local_280._8_4_ = fVar183;
                      local_280._12_4_ = fVar183;
                      local_270 = *(undefined4 *)((long)&local_300 + uVar73 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2e0 + uVar73 * 4);
                      local_630.context = context->user;
                      fVar190 = 1.0 - fVar183;
                      auVar147 = vfnmadd231ss_fma(ZEXT416((uint)(fVar183 * (fVar190 + fVar190))),
                                                  ZEXT416((uint)fVar190),ZEXT416((uint)fVar190));
                      auVar87 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_280,
                                                ZEXT416(0xc0a00000));
                      auVar91 = vfmadd231ss_fma(ZEXT416((uint)(fVar183 * fVar183 * 3.0)),
                                                ZEXT416((uint)(fVar183 + fVar183)),auVar87);
                      auVar87 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_280,
                                                ZEXT416(0x40000000));
                      auVar87 = vfmadd231ss_fma(ZEXT416((uint)(fVar190 * fVar190 * -3.0)),
                                                ZEXT416((uint)(fVar190 + fVar190)),auVar87);
                      auVar148 = vfmadd231ss_fma(ZEXT416((uint)(fVar183 * fVar183)),local_280,
                                                 ZEXT416((uint)(fVar190 * -2.0)));
                      fVar183 = auVar147._0_4_ * 0.5;
                      fVar190 = auVar91._0_4_ * 0.5;
                      fVar191 = auVar87._0_4_ * 0.5;
                      fVar192 = auVar148._0_4_ * 0.5;
                      auVar175._0_4_ = fVar192 * (float)local_1e0;
                      auVar175._4_4_ = fVar192 * local_1e0._4_4_;
                      auVar175._8_4_ = fVar192 * (float)uStack_1d8;
                      auVar175._12_4_ = fVar192 * uStack_1d8._4_4_;
                      auVar196._4_4_ = fVar191;
                      auVar196._0_4_ = fVar191;
                      auVar196._8_4_ = fVar191;
                      auVar196._12_4_ = fVar191;
                      auVar66._4_4_ = fStack_4fc;
                      auVar66._0_4_ = local_500;
                      auVar66._8_4_ = fStack_4f8;
                      auVar66._12_4_ = fStack_4f4;
                      auVar87 = vfmadd132ps_fma(auVar196,auVar175,auVar66);
                      auVar176._4_4_ = fVar190;
                      auVar176._0_4_ = fVar190;
                      auVar176._8_4_ = fVar190;
                      auVar176._12_4_ = fVar190;
                      auVar67._8_8_ = uStack_4e8;
                      auVar67._0_8_ = local_4f0;
                      auVar87 = vfmadd132ps_fma(auVar176,auVar87,auVar67);
                      auVar149._4_4_ = fVar183;
                      auVar149._0_4_ = fVar183;
                      auVar149._8_4_ = fVar183;
                      auVar149._12_4_ = fVar183;
                      auVar87 = vfmadd213ps_fma(auVar149,auVar89,auVar87);
                      local_2b0 = auVar87._0_4_;
                      local_2a0 = vshufps_avx(auVar87,auVar87,0x55);
                      local_290 = vshufps_avx(auVar87,auVar87,0xaa);
                      iStack_2ac = local_2b0;
                      iStack_2a8 = local_2b0;
                      iStack_2a4 = local_2b0;
                      uStack_26c = local_270;
                      uStack_268 = local_270;
                      uStack_264 = local_270;
                      local_260 = local_4d0._0_8_;
                      uStack_258 = local_4d0._8_8_;
                      local_250 = local_4c0;
                      vpcmpeqd_avx2(ZEXT1632(local_4c0),ZEXT1632(local_4c0));
                      uStack_23c = (local_630.context)->instID[0];
                      local_240 = uStack_23c;
                      uStack_238 = uStack_23c;
                      uStack_234 = uStack_23c;
                      uStack_230 = (local_630.context)->instPrimID[0];
                      uStack_22c = uStack_230;
                      uStack_228 = uStack_230;
                      uStack_224 = uStack_230;
                      local_670 = local_430._0_8_;
                      uStack_668 = local_430._8_8_;
                      local_630.valid = (int *)&local_670;
                      local_630.geometryUserPtr = pGVar78->userPtr;
                      local_630.hit = (RTCHitN *)&local_2b0;
                      local_630.N = 4;
                      local_590._0_4_ = uVar77;
                      local_630.ray = (RTCRayN *)ray;
                      if (pGVar78->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar78->intersectionFilterN)(&local_630);
                        auVar222 = ZEXT3264(local_580);
                        auVar221 = ZEXT3264(local_560);
                        auVar217 = ZEXT3264(local_5e0);
                        auVar218 = ZEXT3264(local_5c0);
                        auVar219 = ZEXT3264(local_480);
                        in_ZMM21 = ZEXT3264(local_540);
                        in_ZMM20 = ZEXT3264(local_520);
                        auVar87 = vxorps_avx512vl(auVar90,auVar90);
                        auVar220 = ZEXT1664(auVar87);
                        pGVar78 = local_5e8;
                        uVar77 = local_590._0_4_;
                      }
                      bVar82 = (byte)uVar77;
                      auVar87 = auVar220._0_16_;
                      auVar59._8_8_ = uStack_668;
                      auVar59._0_8_ = local_670;
                      uVar76 = vptestmd_avx512vl(auVar59,auVar59);
                      if ((uVar76 & 0xf) == 0) {
LAB_01b638fa:
                        *(undefined4 *)(ray + k * 4 + 0x80) = local_4e0;
                      }
                      else {
                        p_Var12 = context->args->filter;
                        if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar78->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var12)(&local_630);
                          bVar82 = local_590[0];
                          auVar222 = ZEXT3264(local_580);
                          auVar221 = ZEXT3264(local_560);
                          auVar217 = ZEXT3264(local_5e0);
                          auVar218 = ZEXT3264(local_5c0);
                          auVar219 = ZEXT3264(local_480);
                          in_ZMM21 = ZEXT3264(local_540);
                          in_ZMM20 = ZEXT3264(local_520);
                          auVar87 = vxorps_avx512vl(auVar87,auVar87);
                          auVar220 = ZEXT1664(auVar87);
                          pGVar78 = local_5e8;
                        }
                        auVar60._8_8_ = uStack_668;
                        auVar60._0_8_ = local_670;
                        uVar76 = vptestmd_avx512vl(auVar60,auVar60);
                        uVar76 = uVar76 & 0xf;
                        bVar72 = (byte)uVar76;
                        if (bVar72 == 0) goto LAB_01b638fa;
                        iVar1 = *(int *)(local_630.hit + 4);
                        iVar2 = *(int *)(local_630.hit + 8);
                        iVar58 = *(int *)(local_630.hit + 0xc);
                        bVar13 = (bool)((byte)(uVar76 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar76 >> 2) & 1);
                        bVar15 = SUB81(uVar76 >> 3,0);
                        *(uint *)(local_630.ray + 0xc0) =
                             (uint)(bVar72 & 1) * *(int *)local_630.hit |
                             (uint)!(bool)(bVar72 & 1) * *(int *)(local_630.ray + 0xc0);
                        *(uint *)(local_630.ray + 0xc4) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_630.ray + 0xc4);
                        *(uint *)(local_630.ray + 200) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_630.ray + 200);
                        *(uint *)(local_630.ray + 0xcc) =
                             (uint)bVar15 * iVar58 | (uint)!bVar15 * *(int *)(local_630.ray + 0xcc);
                        iVar1 = *(int *)(local_630.hit + 0x14);
                        iVar2 = *(int *)(local_630.hit + 0x18);
                        iVar58 = *(int *)(local_630.hit + 0x1c);
                        bVar13 = (bool)((byte)(uVar76 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar76 >> 2) & 1);
                        bVar15 = SUB81(uVar76 >> 3,0);
                        *(uint *)(local_630.ray + 0xd0) =
                             (uint)(bVar72 & 1) * *(int *)(local_630.hit + 0x10) |
                             (uint)!(bool)(bVar72 & 1) * *(int *)(local_630.ray + 0xd0);
                        *(uint *)(local_630.ray + 0xd4) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_630.ray + 0xd4);
                        *(uint *)(local_630.ray + 0xd8) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_630.ray + 0xd8);
                        *(uint *)(local_630.ray + 0xdc) =
                             (uint)bVar15 * iVar58 | (uint)!bVar15 * *(int *)(local_630.ray + 0xdc);
                        iVar1 = *(int *)(local_630.hit + 0x24);
                        iVar2 = *(int *)(local_630.hit + 0x28);
                        iVar58 = *(int *)(local_630.hit + 0x2c);
                        bVar13 = (bool)((byte)(uVar76 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar76 >> 2) & 1);
                        bVar15 = SUB81(uVar76 >> 3,0);
                        *(uint *)(local_630.ray + 0xe0) =
                             (uint)(bVar72 & 1) * *(int *)(local_630.hit + 0x20) |
                             (uint)!(bool)(bVar72 & 1) * *(int *)(local_630.ray + 0xe0);
                        *(uint *)(local_630.ray + 0xe4) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_630.ray + 0xe4);
                        *(uint *)(local_630.ray + 0xe8) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_630.ray + 0xe8);
                        *(uint *)(local_630.ray + 0xec) =
                             (uint)bVar15 * iVar58 | (uint)!bVar15 * *(int *)(local_630.ray + 0xec);
                        iVar1 = *(int *)(local_630.hit + 0x34);
                        iVar2 = *(int *)(local_630.hit + 0x38);
                        iVar58 = *(int *)(local_630.hit + 0x3c);
                        bVar13 = (bool)((byte)(uVar76 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar76 >> 2) & 1);
                        bVar15 = SUB81(uVar76 >> 3,0);
                        *(uint *)(local_630.ray + 0xf0) =
                             (uint)(bVar72 & 1) * *(int *)(local_630.hit + 0x30) |
                             (uint)!(bool)(bVar72 & 1) * *(int *)(local_630.ray + 0xf0);
                        *(uint *)(local_630.ray + 0xf4) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_630.ray + 0xf4);
                        *(uint *)(local_630.ray + 0xf8) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_630.ray + 0xf8);
                        *(uint *)(local_630.ray + 0xfc) =
                             (uint)bVar15 * iVar58 | (uint)!bVar15 * *(int *)(local_630.ray + 0xfc);
                        auVar87 = *(undefined1 (*) [16])(local_630.ray + 0x100);
                        auVar94._0_4_ =
                             (uint)(bVar72 & 1) * *(int *)(local_630.hit + 0x40) |
                             (uint)!(bool)(bVar72 & 1) * auVar87._0_4_;
                        bVar13 = (bool)((byte)(uVar76 >> 1) & 1);
                        auVar94._4_4_ =
                             (uint)bVar13 * *(int *)(local_630.hit + 0x44) |
                             (uint)!bVar13 * auVar87._4_4_;
                        bVar13 = (bool)((byte)(uVar76 >> 2) & 1);
                        auVar94._8_4_ =
                             (uint)bVar13 * *(int *)(local_630.hit + 0x48) |
                             (uint)!bVar13 * auVar87._8_4_;
                        bVar13 = SUB81(uVar76 >> 3,0);
                        auVar94._12_4_ =
                             (uint)bVar13 * *(int *)(local_630.hit + 0x4c) |
                             (uint)!bVar13 * auVar87._12_4_;
                        *(undefined1 (*) [16])(local_630.ray + 0x100) = auVar94;
                        auVar87 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_630.hit + 0x50));
                        *(undefined1 (*) [16])(local_630.ray + 0x110) = auVar87;
                        auVar87 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_630.hit + 0x60));
                        *(undefined1 (*) [16])(local_630.ray + 0x120) = auVar87;
                        auVar87 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_630.hit + 0x70));
                        *(undefined1 (*) [16])(local_630.ray + 0x130) = auVar87;
                        auVar87 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_630.hit + 0x80));
                        *(undefined1 (*) [16])(local_630.ray + 0x140) = auVar87;
                      }
                      bVar82 = ~(byte)(1 << ((uint)uVar73 & 0x1f)) & bVar82;
                      uVar144 = *(undefined4 *)(ray + k * 4 + 0x80);
                      auVar33._4_4_ = uVar144;
                      auVar33._0_4_ = uVar144;
                      auVar33._8_4_ = uVar144;
                      auVar33._12_4_ = uVar144;
                      auVar33._16_4_ = uVar144;
                      auVar33._20_4_ = uVar144;
                      auVar33._24_4_ = uVar144;
                      auVar33._28_4_ = uVar144;
                      uVar158 = vcmpps_avx512vl(in_ZMM21._0_32_,auVar33,2);
                      bVar72 = bVar82 & (byte)uVar158;
                      uVar77 = (uint)bVar72;
                      if ((bVar82 & (byte)uVar158) != 0) {
                        auVar156._8_4_ = 0x7f800000;
                        auVar156._0_8_ = 0x7f8000007f800000;
                        auVar156._12_4_ = 0x7f800000;
                        auVar156._16_4_ = 0x7f800000;
                        auVar156._20_4_ = 0x7f800000;
                        auVar156._24_4_ = 0x7f800000;
                        auVar156._28_4_ = 0x7f800000;
                        auVar112 = vblendmps_avx512vl(auVar156,in_ZMM21._0_32_);
                        auVar133._0_4_ =
                             (uint)(bVar72 & 1) * auVar112._0_4_ |
                             (uint)!(bool)(bVar72 & 1) * 0x7f800000;
                        bVar13 = (bool)(bVar72 >> 1 & 1);
                        auVar133._4_4_ = (uint)bVar13 * auVar112._4_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar72 >> 2 & 1);
                        auVar133._8_4_ = (uint)bVar13 * auVar112._8_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar72 >> 3 & 1);
                        auVar133._12_4_ =
                             (uint)bVar13 * auVar112._12_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar72 >> 4 & 1);
                        auVar133._16_4_ =
                             (uint)bVar13 * auVar112._16_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar72 >> 5 & 1);
                        auVar133._20_4_ =
                             (uint)bVar13 * auVar112._20_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar72 >> 6 & 1);
                        auVar133._24_4_ =
                             (uint)bVar13 * auVar112._24_4_ | (uint)!bVar13 * 0x7f800000;
                        auVar133._28_4_ =
                             (uint)(bVar72 >> 7) * auVar112._28_4_ |
                             (uint)!(bool)(bVar72 >> 7) * 0x7f800000;
                        auVar112 = vshufps_avx(auVar133,auVar133,0xb1);
                        auVar112 = vminps_avx(auVar133,auVar112);
                        auVar113 = vshufpd_avx(auVar112,auVar112,5);
                        auVar112 = vminps_avx(auVar112,auVar113);
                        auVar113 = vpermpd_avx2(auVar112,0x4e);
                        auVar112 = vminps_avx(auVar112,auVar113);
                        uVar158 = vcmpps_avx512vl(auVar133,auVar112,0);
                        bVar82 = (byte)uVar158 & bVar72;
                        uVar75 = uVar77;
                        if (bVar82 != 0) {
                          uVar75 = (uint)bVar82;
                        }
                        uVar74 = 0;
                        for (; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x80000000) {
                          uVar74 = uVar74 + 1;
                        }
                        uVar73 = (ulong)uVar74;
                      }
                    } while (bVar72 != 0);
                  }
                }
              }
            }
          }
          auVar203 = ZEXT3264(auVar179);
          auVar181 = ZEXT3264(auVar121);
          lVar80 = lVar80 + 8;
        } while ((int)lVar80 < iVar10);
      }
      uVar144 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar25._4_4_ = uVar144;
      auVar25._0_4_ = uVar144;
      auVar25._8_4_ = uVar144;
      auVar25._12_4_ = uVar144;
      uVar158 = vcmpps_avx512vl(local_1d0,auVar25,2);
      uVar79 = (uint)uVar81 & (uint)uVar158;
      uVar81 = (ulong)uVar79;
    } while (uVar79 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }